

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersectorK<4,8>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [28];
  undefined1 auVar28 [28];
  undefined1 auVar29 [28];
  undefined1 auVar30 [28];
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  byte bVar37;
  uint uVar38;
  ulong uVar39;
  long lVar41;
  uint uVar42;
  long lVar43;
  ulong uVar44;
  uint uVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  ulong uVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  undefined1 auVar104 [32];
  undefined1 auVar106 [32];
  undefined1 auVar108 [32];
  undefined1 auVar110 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  int iVar117;
  float fVar118;
  undefined4 uVar119;
  float fVar127;
  vint4 bi_2;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  vint4 bi_1;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  vint4 bi;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  vfloat4 a0;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  vint4 ai_2;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  vint4 ai_1;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  vint4 ai;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  float fVar192;
  float fVar200;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar201;
  float fVar216;
  float fVar217;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar218;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  vfloat4 a0_3;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar234;
  float fVar243;
  float fVar244;
  vfloat4 b0_2;
  undefined1 auVar235 [16];
  float fVar245;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar246;
  float fVar247;
  float fVar248;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  vfloat4 a0_4;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 in_ZMM18 [64];
  undefined1 auVar279 [64];
  undefined1 auVar280 [64];
  undefined1 auVar281 [64];
  undefined1 in_ZMM22 [64];
  undefined1 auVar282 [64];
  undefined1 auVar283 [64];
  undefined1 auVar284 [64];
  undefined1 auVar285 [64];
  undefined1 auVar286 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  RTCFilterFunctionNArguments local_470;
  undefined1 local_440 [16];
  uint auStack_430 [4];
  undefined1 local_420 [32];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [8];
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  undefined8 uStack_240;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar40;
  undefined1 auVar101 [32];
  undefined1 auVar103 [32];
  undefined1 auVar105 [32];
  undefined1 auVar107 [32];
  undefined1 auVar109 [32];
  undefined1 auVar111 [32];
  uint uVar116;
  float fVar145;
  float fVar154;
  float fVar155;
  float fVar172;
  float fVar173;
  float fVar191;
  undefined1 auVar271 [32];
  
  PVar6 = prim[1];
  uVar39 = (ulong)(byte)PVar6;
  lVar41 = uVar39 * 0x25;
  fVar118 = *(float *)(prim + lVar41 + 0x12);
  auVar51 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar51 = vinsertps_avx(auVar51,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar52 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar52 = vinsertps_avx(auVar52,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar51 = vsubps_avx(auVar51,*(undefined1 (*) [16])(prim + lVar41 + 6));
  auVar74._0_4_ = fVar118 * auVar51._0_4_;
  auVar74._4_4_ = fVar118 * auVar51._4_4_;
  auVar74._8_4_ = fVar118 * auVar51._8_4_;
  auVar74._12_4_ = fVar118 * auVar51._12_4_;
  auVar51 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar39 * 4 + 6)));
  auVar55._0_4_ = fVar118 * auVar52._0_4_;
  auVar55._4_4_ = fVar118 * auVar52._4_4_;
  auVar55._8_4_ = fVar118 * auVar52._8_4_;
  auVar55._12_4_ = fVar118 * auVar52._12_4_;
  auVar51 = vcvtdq2ps_avx(auVar51);
  auVar52 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar39 * 5 + 6)));
  auVar52 = vcvtdq2ps_avx(auVar52);
  auVar53 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar39 * 6 + 6)));
  auVar61 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar39 * 0xf + 6)));
  auVar53 = vcvtdq2ps_avx(auVar53);
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar67 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar39 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar39 * 0x1a + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar39 * 0x1b + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar39 * 0x1c + 6)));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar156._4_4_ = auVar55._0_4_;
  auVar156._0_4_ = auVar55._0_4_;
  auVar156._8_4_ = auVar55._0_4_;
  auVar156._12_4_ = auVar55._0_4_;
  auVar69 = vshufps_avx(auVar55,auVar55,0x55);
  auVar70 = vshufps_avx(auVar55,auVar55,0xaa);
  fVar118 = auVar70._0_4_;
  auVar63._0_4_ = fVar118 * auVar53._0_4_;
  fVar127 = auVar70._4_4_;
  auVar63._4_4_ = fVar127 * auVar53._4_4_;
  fVar248 = auVar70._8_4_;
  auVar63._8_4_ = fVar248 * auVar53._8_4_;
  fVar234 = auVar70._12_4_;
  auVar63._12_4_ = fVar234 * auVar53._12_4_;
  auVar75._0_4_ = auVar64._0_4_ * fVar118;
  auVar75._4_4_ = auVar64._4_4_ * fVar127;
  auVar75._8_4_ = auVar64._8_4_ * fVar248;
  auVar75._12_4_ = auVar64._12_4_ * fVar234;
  auVar56._0_4_ = auVar68._0_4_ * fVar118;
  auVar56._4_4_ = auVar68._4_4_ * fVar127;
  auVar56._8_4_ = auVar68._8_4_ * fVar248;
  auVar56._12_4_ = auVar68._12_4_ * fVar234;
  auVar70 = vfmadd231ps_fma(auVar63,auVar69,auVar52);
  auVar19 = vfmadd231ps_fma(auVar75,auVar69,auVar67);
  auVar69 = vfmadd231ps_fma(auVar56,auVar66,auVar69);
  auVar20 = vfmadd231ps_fma(auVar70,auVar156,auVar51);
  auVar19 = vfmadd231ps_fma(auVar19,auVar156,auVar61);
  auVar71 = vfmadd231ps_fma(auVar69,auVar65,auVar156);
  auVar265._4_4_ = auVar74._0_4_;
  auVar265._0_4_ = auVar74._0_4_;
  auVar265._8_4_ = auVar74._0_4_;
  auVar265._12_4_ = auVar74._0_4_;
  auVar69 = vshufps_avx(auVar74,auVar74,0x55);
  auVar70 = vshufps_avx(auVar74,auVar74,0xaa);
  fVar118 = auVar70._0_4_;
  auVar157._0_4_ = fVar118 * auVar53._0_4_;
  fVar127 = auVar70._4_4_;
  auVar157._4_4_ = fVar127 * auVar53._4_4_;
  fVar248 = auVar70._8_4_;
  auVar157._8_4_ = fVar248 * auVar53._8_4_;
  fVar234 = auVar70._12_4_;
  auVar157._12_4_ = fVar234 * auVar53._12_4_;
  auVar77._0_4_ = auVar64._0_4_ * fVar118;
  auVar77._4_4_ = auVar64._4_4_ * fVar127;
  auVar77._8_4_ = auVar64._8_4_ * fVar248;
  auVar77._12_4_ = auVar64._12_4_ * fVar234;
  auVar76._0_4_ = auVar68._0_4_ * fVar118;
  auVar76._4_4_ = auVar68._4_4_ * fVar127;
  auVar76._8_4_ = auVar68._8_4_ * fVar248;
  auVar76._12_4_ = auVar68._12_4_ * fVar234;
  auVar52 = vfmadd231ps_fma(auVar157,auVar69,auVar52);
  auVar53 = vfmadd231ps_fma(auVar77,auVar69,auVar67);
  auVar67 = vfmadd231ps_fma(auVar76,auVar69,auVar66);
  auVar54 = vfmadd231ps_fma(auVar52,auVar265,auVar51);
  auVar55 = vfmadd231ps_fma(auVar53,auVar265,auVar61);
  auVar75 = in_YmmResult._16_16_;
  auVar51 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar283 = ZEXT1664(auVar51);
  auVar56 = vfmadd231ps_fma(auVar67,auVar265,auVar65);
  auVar52 = vandps_avx512vl(auVar20,auVar51);
  auVar193._8_4_ = 0x219392ef;
  auVar193._0_8_ = 0x219392ef219392ef;
  auVar193._12_4_ = 0x219392ef;
  uVar50 = vcmpps_avx512vl(auVar52,auVar193,1);
  bVar48 = (bool)((byte)uVar50 & 1);
  auVar57._0_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar20._0_4_;
  bVar48 = (bool)((byte)(uVar50 >> 1) & 1);
  auVar57._4_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar20._4_4_;
  bVar48 = (bool)((byte)(uVar50 >> 2) & 1);
  auVar57._8_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar20._8_4_;
  bVar48 = (bool)((byte)(uVar50 >> 3) & 1);
  auVar57._12_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar20._12_4_;
  auVar52 = vandps_avx512vl(auVar19,auVar51);
  uVar50 = vcmpps_avx512vl(auVar52,auVar193,1);
  bVar48 = (bool)((byte)uVar50 & 1);
  auVar58._0_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar19._0_4_;
  bVar48 = (bool)((byte)(uVar50 >> 1) & 1);
  auVar58._4_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar19._4_4_;
  bVar48 = (bool)((byte)(uVar50 >> 2) & 1);
  auVar58._8_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar19._8_4_;
  bVar48 = (bool)((byte)(uVar50 >> 3) & 1);
  auVar58._12_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar19._12_4_;
  auVar51 = vandps_avx512vl(auVar71,auVar51);
  uVar50 = vcmpps_avx512vl(auVar51,auVar193,1);
  bVar48 = (bool)((byte)uVar50 & 1);
  auVar59._0_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar71._0_4_;
  bVar48 = (bool)((byte)(uVar50 >> 1) & 1);
  auVar59._4_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar71._4_4_;
  bVar48 = (bool)((byte)(uVar50 >> 2) & 1);
  auVar59._8_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar71._8_4_;
  bVar48 = (bool)((byte)(uVar50 >> 3) & 1);
  auVar59._12_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar71._12_4_;
  auVar51 = vrcp14ps_avx512vl(auVar57);
  auVar52 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar284 = ZEXT1664(auVar52);
  auVar53 = vfnmadd213ps_avx512vl(auVar57,auVar51,auVar52);
  auVar20 = vfmadd132ps_fma(auVar53,auVar51,auVar51);
  auVar51 = vrcp14ps_avx512vl(auVar58);
  auVar53 = vfnmadd213ps_avx512vl(auVar58,auVar51,auVar52);
  auVar71 = vfmadd132ps_fma(auVar53,auVar51,auVar51);
  auVar51 = vrcp14ps_avx512vl(auVar59);
  auVar52 = vfnmadd213ps_avx512vl(auVar59,auVar51,auVar52);
  auVar72 = vfmadd132ps_fma(auVar52,auVar51,auVar51);
  fVar118 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar41 + 0x16)) *
            *(float *)(prim + lVar41 + 0x1a);
  auVar174._4_4_ = fVar118;
  auVar174._0_4_ = fVar118;
  auVar174._8_4_ = fVar118;
  auVar174._12_4_ = fVar118;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar39 * 7 + 6);
  auVar51 = vpmovsxwd_avx(auVar51);
  auVar51 = vcvtdq2ps_avx(auVar51);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar39 * 0xb + 6);
  auVar52 = vpmovsxwd_avx(auVar52);
  auVar52 = vcvtdq2ps_avx(auVar52);
  auVar61 = vsubps_avx(auVar52,auVar51);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + uVar39 * 9 + 6);
  auVar52 = vpmovsxwd_avx(auVar53);
  auVar53 = vfmadd213ps_fma(auVar61,auVar174,auVar51);
  auVar51 = vcvtdq2ps_avx(auVar52);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *(ulong *)(prim + uVar39 * 0xd + 6);
  auVar52 = vpmovsxwd_avx(auVar61);
  auVar52 = vcvtdq2ps_avx(auVar52);
  auVar52 = vsubps_avx(auVar52,auVar51);
  auVar61 = vfmadd213ps_fma(auVar52,auVar174,auVar51);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *(ulong *)(prim + uVar39 * 0x12 + 6);
  auVar51 = vpmovsxwd_avx(auVar67);
  auVar51 = vcvtdq2ps_avx(auVar51);
  uVar50 = (ulong)(uint)((int)(uVar39 * 5) << 2);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *(ulong *)(prim + uVar39 * 2 + uVar50 + 6);
  auVar52 = vpmovsxwd_avx(auVar64);
  auVar52 = vcvtdq2ps_avx(auVar52);
  auVar52 = vsubps_avx(auVar52,auVar51);
  auVar67 = vfmadd213ps_fma(auVar52,auVar174,auVar51);
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *(ulong *)(prim + uVar50 + 6);
  auVar51 = vpmovsxwd_avx(auVar65);
  auVar51 = vcvtdq2ps_avx(auVar51);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *(ulong *)(prim + uVar39 * 0x18 + 6);
  auVar52 = vpmovsxwd_avx(auVar66);
  auVar52 = vcvtdq2ps_avx(auVar52);
  auVar52 = vsubps_avx(auVar52,auVar51);
  auVar64 = vfmadd213ps_fma(auVar52,auVar174,auVar51);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + uVar39 * 0x1d + 6);
  auVar51 = vpmovsxwd_avx(auVar68);
  auVar51 = vcvtdq2ps_avx(auVar51);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar39 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar52 = vpmovsxwd_avx(auVar69);
  auVar52 = vcvtdq2ps_avx(auVar52);
  auVar52 = vsubps_avx(auVar52,auVar51);
  auVar65 = vfmadd213ps_fma(auVar52,auVar174,auVar51);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar39) + 6);
  auVar51 = vpmovsxwd_avx(auVar70);
  auVar51 = vcvtdq2ps_avx(auVar51);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar39 * 0x23 + 6);
  auVar52 = vpmovsxwd_avx(auVar19);
  auVar52 = vcvtdq2ps_avx(auVar52);
  auVar52 = vsubps_avx(auVar52,auVar51);
  auVar52 = vfmadd213ps_fma(auVar52,auVar174,auVar51);
  auVar51 = vsubps_avx(auVar53,auVar54);
  auVar175._0_4_ = auVar20._0_4_ * auVar51._0_4_;
  auVar175._4_4_ = auVar20._4_4_ * auVar51._4_4_;
  auVar175._8_4_ = auVar20._8_4_ * auVar51._8_4_;
  auVar175._12_4_ = auVar20._12_4_ * auVar51._12_4_;
  auVar51 = vsubps_avx(auVar61,auVar54);
  auVar73._0_4_ = auVar20._0_4_ * auVar51._0_4_;
  auVar73._4_4_ = auVar20._4_4_ * auVar51._4_4_;
  auVar73._8_4_ = auVar20._8_4_ * auVar51._8_4_;
  auVar73._12_4_ = auVar20._12_4_ * auVar51._12_4_;
  auVar51 = vsubps_avx(auVar67,auVar55);
  auVar158._0_4_ = auVar71._0_4_ * auVar51._0_4_;
  auVar158._4_4_ = auVar71._4_4_ * auVar51._4_4_;
  auVar158._8_4_ = auVar71._8_4_ * auVar51._8_4_;
  auVar158._12_4_ = auVar71._12_4_ * auVar51._12_4_;
  auVar51 = vsubps_avx(auVar64,auVar55);
  auVar62._0_4_ = auVar71._0_4_ * auVar51._0_4_;
  auVar62._4_4_ = auVar71._4_4_ * auVar51._4_4_;
  auVar62._8_4_ = auVar71._8_4_ * auVar51._8_4_;
  auVar62._12_4_ = auVar71._12_4_ * auVar51._12_4_;
  auVar51 = vsubps_avx(auVar65,auVar56);
  auVar78._0_4_ = auVar72._0_4_ * auVar51._0_4_;
  auVar78._4_4_ = auVar72._4_4_ * auVar51._4_4_;
  auVar78._8_4_ = auVar72._8_4_ * auVar51._8_4_;
  auVar78._12_4_ = auVar72._12_4_ * auVar51._12_4_;
  auVar51 = vsubps_avx(auVar52,auVar56);
  auVar60._0_4_ = auVar72._0_4_ * auVar51._0_4_;
  auVar60._4_4_ = auVar72._4_4_ * auVar51._4_4_;
  auVar60._8_4_ = auVar72._8_4_ * auVar51._8_4_;
  auVar60._12_4_ = auVar72._12_4_ * auVar51._12_4_;
  auVar51 = vpminsd_avx(auVar175,auVar73);
  auVar52 = vpminsd_avx(auVar158,auVar62);
  auVar51 = vmaxps_avx(auVar51,auVar52);
  auVar52 = vpminsd_avx(auVar78,auVar60);
  uVar119 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar20._4_4_ = uVar119;
  auVar20._0_4_ = uVar119;
  auVar20._8_4_ = uVar119;
  auVar20._12_4_ = uVar119;
  auVar52 = vmaxps_avx512vl(auVar52,auVar20);
  auVar51 = vmaxps_avx(auVar51,auVar52);
  auVar71._8_4_ = 0x3f7ffffa;
  auVar71._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar71._12_4_ = 0x3f7ffffa;
  local_3f0 = vmulps_avx512vl(auVar51,auVar71);
  auVar51 = vpmaxsd_avx(auVar175,auVar73);
  auVar52 = vpmaxsd_avx(auVar158,auVar62);
  auVar51 = vminps_avx(auVar51,auVar52);
  auVar52 = vpmaxsd_avx(auVar78,auVar60);
  uVar119 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar72._4_4_ = uVar119;
  auVar72._0_4_ = uVar119;
  auVar72._8_4_ = uVar119;
  auVar72._12_4_ = uVar119;
  auVar52 = vminps_avx512vl(auVar52,auVar72);
  auVar51 = vminps_avx(auVar51,auVar52);
  auVar54._8_4_ = 0x3f800003;
  auVar54._0_8_ = 0x3f8000033f800003;
  auVar54._12_4_ = 0x3f800003;
  auVar51 = vmulps_avx512vl(auVar51,auVar54);
  auVar52 = vpbroadcastd_avx512vl();
  uVar17 = vcmpps_avx512vl(local_3f0,auVar51,2);
  uVar50 = vpcmpgtd_avx512vl(auVar52,_DAT_01f7fcf0);
  uVar50 = ((byte)uVar17 & 0xf) & uVar50;
  if ((char)uVar50 == '\0') {
    return;
  }
  local_220 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar51 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
  auVar279 = ZEXT1664(auVar51);
  auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar286 = ZEXT1664(auVar51);
LAB_01bc88d2:
  lVar41 = 0;
  for (uVar39 = uVar50; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
    lVar41 = lVar41 + 1;
  }
  uVar45 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar45].ptr;
  fVar118 = (pGVar8->time_range).lower;
  fVar248 = pGVar8->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar118) / ((pGVar8->time_range).upper - fVar118));
  auVar51 = vroundss_avx(ZEXT416((uint)fVar248),ZEXT416((uint)fVar248),9);
  uVar7 = *(uint *)(prim + lVar41 * 4 + 6);
  auVar52 = vaddss_avx512f(ZEXT416((uint)pGVar8->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar51 = vminss_avx(auVar51,auVar52);
  auVar54 = vmaxss_avx512f(auVar279._0_16_,auVar51);
  uVar39 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)uVar7 *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar43 = (long)(int)auVar54._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar43);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar43);
  auVar51 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar39);
  lVar41 = uVar39 + 1;
  auVar52 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar41);
  lVar1 = uVar39 + 2;
  auVar53 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar2 = uVar39 + 3;
  auVar61 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar43);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar43);
  auVar67 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar39);
  auVar64 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar41);
  auVar65 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  auVar66 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  lVar11 = *(long *)(_Var9 + 0x38 + lVar43);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar43);
  auVar68 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar39);
  auVar69 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar41);
  auVar70 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  auVar19 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  lVar11 = *(long *)(lVar10 + 0x38 + lVar43);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar43);
  auVar20 = *(undefined1 (*) [16])(lVar11 + uVar39 * lVar10);
  auVar71 = *(undefined1 (*) [16])(lVar11 + lVar41 * lVar10);
  auVar72 = *(undefined1 (*) [16])(lVar11 + lVar1 * lVar10);
  fVar248 = fVar248 - auVar54._0_4_;
  auVar94._0_16_ = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
  auVar54 = vmulps_avx512vl(auVar61,auVar94._0_16_);
  auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaab));
  auVar56 = vfmadd213ps_avx512vl(auVar55,auVar53,auVar54);
  auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar52,auVar57);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar51,auVar55);
  auVar73 = auVar286._0_16_;
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar53,auVar73);
  auVar54 = vfnmadd231ps_avx512vl(auVar54,auVar52,auVar94._0_16_);
  auVar54 = vfnmadd231ps_avx512vl(auVar54,auVar51,auVar73);
  auVar58 = vmulps_avx512vl(auVar66,auVar94._0_16_);
  auVar59 = vfmadd213ps_avx512vl(auVar55,auVar65,auVar58);
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar64,auVar57);
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar67,auVar55);
  auVar58 = vfmadd231ps_avx512vl(auVar58,auVar65,auVar73);
  auVar58 = vfnmadd231ps_avx512vl(auVar58,auVar64,auVar94._0_16_);
  auVar58 = vfnmadd231ps_avx512vl(auVar58,auVar67,auVar73);
  auVar60 = vmulps_avx512vl(auVar61,auVar55);
  auVar60 = vfmadd231ps_avx512vl(auVar60,auVar53,auVar57);
  auVar60 = vfmadd231ps_avx512vl(auVar60,auVar52,auVar55);
  auVar60 = vfmadd231ps_avx512vl(auVar60,auVar51,auVar94._0_16_);
  auVar61 = vmulps_avx512vl(auVar61,auVar73);
  auVar53 = vfmadd231ps_avx512vl(auVar61,auVar94._0_16_,auVar53);
  auVar52 = vfnmadd231ps_avx512vl(auVar53,auVar73,auVar52);
  auVar62 = vfnmadd231ps_avx512vl(auVar52,auVar94._0_16_,auVar51);
  auVar51 = vmulps_avx512vl(auVar66,auVar55);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar65,auVar57);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar64,auVar55);
  auVar63 = vfmadd231ps_avx512vl(auVar51,auVar67,auVar94._0_16_);
  auVar51 = vmulps_avx512vl(auVar66,auVar73);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar94._0_16_,auVar65);
  auVar51 = vfnmadd231ps_avx512vl(auVar51,auVar73,auVar64);
  auVar64 = vfnmadd231ps_avx512vl(auVar51,auVar94._0_16_,auVar67);
  auVar52 = vshufps_avx512vl(auVar54,auVar54,0xc9);
  auVar51 = vshufps_avx512vl(auVar59,auVar59,0xc9);
  auVar51 = vmulps_avx512vl(auVar54,auVar51);
  auVar51 = vfmsub231ps_avx512vl(auVar51,auVar52,auVar59);
  auVar53 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar51 = vshufps_avx(auVar58,auVar58,0xc9);
  auVar51 = vmulps_avx512vl(auVar54,auVar51);
  auVar51 = vfmsub231ps_fma(auVar51,auVar52,auVar58);
  auVar61 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar51 = vshufps_avx(auVar62,auVar62,0xc9);
  auVar52 = vshufps_avx(auVar63,auVar63,0xc9);
  auVar176._0_4_ = auVar62._0_4_ * auVar52._0_4_;
  auVar176._4_4_ = auVar62._4_4_ * auVar52._4_4_;
  auVar176._8_4_ = auVar62._8_4_ * auVar52._8_4_;
  auVar176._12_4_ = auVar62._12_4_ * auVar52._12_4_;
  auVar52 = vfmsub231ps_fma(auVar176,auVar51,auVar63);
  auVar67 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar52 = vshufps_avx(auVar64,auVar64,0xc9);
  auVar177._0_4_ = auVar62._0_4_ * auVar52._0_4_;
  auVar177._4_4_ = auVar62._4_4_ * auVar52._4_4_;
  auVar177._8_4_ = auVar62._8_4_ * auVar52._8_4_;
  auVar177._12_4_ = auVar62._12_4_ * auVar52._12_4_;
  auVar51 = vfmsub231ps_fma(auVar177,auVar51,auVar64);
  auVar64 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar51 = vdpps_avx(auVar53,auVar53,0x7f);
  auVar94._16_16_ = auVar75;
  auVar97._4_28_ = auVar94._4_28_;
  auVar97._0_4_ = auVar51._0_4_;
  auVar52 = vrsqrt14ss_avx512f(auVar94._0_16_,auVar97._0_16_);
  auVar65 = vmulss_avx512f(auVar52,ZEXT416(0x3fc00000));
  auVar66 = vmulss_avx512f(auVar51,ZEXT416(0xbf000000));
  auVar66 = vmulss_avx512f(auVar66,auVar52);
  auVar52 = vmulss_avx512f(auVar66,ZEXT416((uint)(auVar52._0_4_ * auVar52._0_4_)));
  fVar118 = auVar65._0_4_ + auVar52._0_4_;
  auVar202._4_4_ = fVar118;
  auVar202._0_4_ = fVar118;
  auVar202._8_4_ = fVar118;
  auVar202._12_4_ = fVar118;
  auVar52 = vdpps_avx(auVar53,auVar61,0x7f);
  auVar65 = vmulps_avx512vl(auVar53,auVar202);
  auVar66 = vbroadcastss_avx512vl(auVar51);
  auVar61 = vmulps_avx512vl(auVar66,auVar61);
  fVar127 = auVar52._0_4_;
  auVar159._0_4_ = fVar127 * auVar53._0_4_;
  auVar159._4_4_ = fVar127 * auVar53._4_4_;
  auVar159._8_4_ = fVar127 * auVar53._8_4_;
  auVar159._12_4_ = fVar127 * auVar53._12_4_;
  auVar53 = vsubps_avx(auVar61,auVar159);
  auVar52 = vrcp14ss_avx512f(auVar94._0_16_,auVar97._0_16_);
  auVar51 = vfnmadd213ss_avx512f(auVar51,auVar52,ZEXT416(0x40000000));
  fVar234 = auVar52._0_4_ * auVar51._0_4_;
  auVar51 = vdpps_avx(auVar67,auVar67,0x7f);
  auVar96._16_16_ = auVar75;
  auVar96._0_16_ = auVar94._0_16_;
  auVar79._4_28_ = auVar96._4_28_;
  auVar79._0_4_ = auVar51._0_4_;
  auVar52 = vrsqrt14ss_avx512f(auVar94._0_16_,auVar79._0_16_);
  auVar61 = vmulss_avx512f(auVar52,ZEXT416(0x3fc00000));
  auVar66 = vmulss_avx512f(auVar51,ZEXT416(0xbf000000));
  fVar127 = auVar52._0_4_;
  fVar127 = auVar61._0_4_ + auVar66._0_4_ * fVar127 * fVar127 * fVar127;
  auVar203._0_4_ = auVar67._0_4_ * fVar127;
  auVar203._4_4_ = auVar67._4_4_ * fVar127;
  auVar203._8_4_ = auVar67._8_4_ * fVar127;
  auVar203._12_4_ = auVar67._12_4_ * fVar127;
  auVar52 = vdpps_avx(auVar67,auVar64,0x7f);
  auVar61 = vbroadcastss_avx512vl(auVar51);
  auVar61 = vmulps_avx512vl(auVar61,auVar64);
  fVar243 = auVar52._0_4_;
  auVar128._0_4_ = fVar243 * auVar67._0_4_;
  auVar128._4_4_ = fVar243 * auVar67._4_4_;
  auVar128._8_4_ = fVar243 * auVar67._8_4_;
  auVar128._12_4_ = fVar243 * auVar67._12_4_;
  auVar52 = vsubps_avx(auVar61,auVar128);
  auVar61 = vrcp14ss_avx512f(auVar94._0_16_,auVar79._0_16_);
  auVar51 = vfnmadd213ss_avx512f(auVar51,auVar61,ZEXT416(0x40000000));
  fVar243 = auVar61._0_4_ * auVar51._0_4_;
  auVar51 = vshufps_avx512vl(auVar56,auVar56,0xff);
  auVar61 = vmulps_avx512vl(auVar51,auVar65);
  auVar58 = vsubps_avx512vl(auVar56,auVar61);
  auVar67 = vshufps_avx512vl(auVar54,auVar54,0xff);
  auVar67 = vmulps_avx512vl(auVar67,auVar65);
  auVar146._0_4_ = auVar67._0_4_ + auVar51._0_4_ * fVar118 * fVar234 * auVar53._0_4_;
  auVar146._4_4_ = auVar67._4_4_ + auVar51._4_4_ * fVar118 * fVar234 * auVar53._4_4_;
  auVar146._8_4_ = auVar67._8_4_ + auVar51._8_4_ * fVar118 * fVar234 * auVar53._8_4_;
  auVar146._12_4_ = auVar67._12_4_ + auVar51._12_4_ * fVar118 * fVar234 * auVar53._12_4_;
  auVar53 = vsubps_avx512vl(auVar54,auVar146);
  auVar56 = vaddps_avx512vl(auVar56,auVar61);
  auVar61 = vaddps_avx512vl(auVar54,auVar146);
  auVar51 = vshufps_avx512vl(auVar60,auVar60,0xff);
  auVar67 = vmulps_avx512vl(auVar51,auVar203);
  auVar54 = vsubps_avx512vl(auVar60,auVar67);
  auVar64 = vshufps_avx512vl(auVar62,auVar62,0xff);
  auVar64 = vmulps_avx512vl(auVar64,auVar203);
  auVar204._0_4_ = auVar64._0_4_ + auVar51._0_4_ * fVar127 * auVar52._0_4_ * fVar243;
  auVar204._4_4_ = auVar64._4_4_ + auVar51._4_4_ * fVar127 * auVar52._4_4_ * fVar243;
  auVar204._8_4_ = auVar64._8_4_ + auVar51._8_4_ * fVar127 * auVar52._8_4_ * fVar243;
  auVar204._12_4_ = auVar64._12_4_ + auVar51._12_4_ * fVar127 * auVar52._12_4_ * fVar243;
  auVar51 = vsubps_avx(auVar62,auVar204);
  auVar59 = vaddps_avx512vl(auVar60,auVar67);
  auVar52 = vaddps_avx512vl(auVar62,auVar204);
  auVar120._8_4_ = 0x3eaaaaab;
  auVar120._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar120._12_4_ = 0x3eaaaaab;
  auVar194._0_4_ = auVar58._0_4_ + auVar53._0_4_ * 0.33333334;
  auVar194._4_4_ = auVar58._4_4_ + auVar53._4_4_ * 0.33333334;
  auVar194._8_4_ = auVar58._8_4_ + auVar53._8_4_ * 0.33333334;
  auVar194._12_4_ = auVar58._12_4_ + auVar53._12_4_ * 0.33333334;
  auVar178._0_4_ = auVar51._0_4_ * 0.33333334;
  auVar178._4_4_ = auVar51._4_4_ * 0.33333334;
  auVar178._8_4_ = auVar51._8_4_ * 0.33333334;
  auVar178._12_4_ = auVar51._12_4_ * 0.33333334;
  auVar65 = vsubps_avx(auVar54,auVar178);
  local_540._4_4_ = auVar56._4_4_ + auVar61._4_4_ * 0.33333334;
  local_540._0_4_ = auVar56._0_4_ + auVar61._0_4_ * 0.33333334;
  fStack_538 = auVar56._8_4_ + auVar61._8_4_ * 0.33333334;
  fStack_534 = auVar56._12_4_ + auVar61._12_4_ * 0.33333334;
  auVar51 = vmulps_avx512vl(auVar52,auVar120);
  auVar66 = vsubps_avx(auVar59,auVar51);
  auVar51 = *(undefined1 (*) [16])(lVar11 + lVar10 * lVar2);
  auVar52 = vmulps_avx512vl(auVar19,auVar94._0_16_);
  auVar53 = vfmadd213ps_avx512vl(auVar55,auVar70,auVar52);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar69,auVar57);
  auVar60 = vfmadd231ps_avx512vl(auVar53,auVar68,auVar55);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar70,auVar73);
  auVar52 = vfnmadd231ps_avx512vl(auVar52,auVar69,auVar94._0_16_);
  auVar62 = vfnmadd231ps_avx512vl(auVar52,auVar68,auVar73);
  auVar52 = vmulps_avx512vl(auVar51,auVar94._0_16_);
  auVar53 = vfmadd213ps_avx512vl(auVar55,auVar72,auVar52);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar71,auVar57);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar20,auVar55);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar72,auVar73);
  auVar52 = vfnmadd231ps_avx512vl(auVar52,auVar71,auVar94._0_16_);
  auVar52 = vfnmadd231ps_avx512vl(auVar52,auVar20,auVar73);
  auVar61 = vmulps_avx512vl(auVar19,auVar55);
  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar70,auVar57);
  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar69,auVar55);
  auVar63 = vfmadd231ps_avx512vl(auVar61,auVar68,auVar94._0_16_);
  auVar61 = vmulps_avx512vl(auVar19,auVar73);
  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar94._0_16_,auVar70);
  auVar61 = vfnmadd231ps_avx512vl(auVar61,auVar73,auVar69);
  auVar68 = vfnmadd231ps_avx512vl(auVar61,auVar94._0_16_,auVar68);
  auVar61 = vmulps_avx512vl(auVar51,auVar55);
  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar72,auVar57);
  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar71,auVar55);
  auVar67 = vfmadd231ps_avx512vl(auVar61,auVar20,auVar94._0_16_);
  auVar51 = vmulps_avx512vl(auVar51,auVar73);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar94._0_16_,auVar72);
  auVar51 = vfnmadd231ps_avx512vl(auVar51,auVar73,auVar71);
  auVar64 = vfnmadd231ps_avx512vl(auVar51,auVar94._0_16_,auVar20);
  auVar51 = vshufps_avx(auVar62,auVar62,0xc9);
  auVar61 = vshufps_avx512vl(auVar53,auVar53,0xc9);
  fVar243 = auVar62._0_4_;
  auVar249._0_4_ = fVar243 * auVar61._0_4_;
  fVar244 = auVar62._4_4_;
  auVar249._4_4_ = fVar244 * auVar61._4_4_;
  fVar145 = auVar62._8_4_;
  auVar249._8_4_ = fVar145 * auVar61._8_4_;
  fVar154 = auVar62._12_4_;
  auVar249._12_4_ = fVar154 * auVar61._12_4_;
  auVar53 = vfmsub231ps_avx512vl(auVar249,auVar51,auVar53);
  auVar53 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar61 = vshufps_avx512vl(auVar52,auVar52,0xc9);
  auVar259._0_4_ = fVar243 * auVar61._0_4_;
  auVar259._4_4_ = fVar244 * auVar61._4_4_;
  auVar259._8_4_ = fVar145 * auVar61._8_4_;
  auVar259._12_4_ = fVar154 * auVar61._12_4_;
  auVar51 = vfmsub231ps_avx512vl(auVar259,auVar51,auVar52);
  auVar61 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar69 = vshufps_avx512vl(auVar68,auVar68,0xc9);
  auVar51 = vshufps_avx(auVar67,auVar67,0xc9);
  auVar51 = vmulps_avx512vl(auVar68,auVar51);
  auVar51 = vfmsub231ps_fma(auVar51,auVar69,auVar67);
  auVar67 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar52 = vshufps_avx(auVar64,auVar64,0xc9);
  auVar51 = vdpps_avx(auVar53,auVar53,0x7f);
  auVar52 = vmulps_avx512vl(auVar68,auVar52);
  auVar52 = vfmsub231ps_fma(auVar52,auVar69,auVar64);
  auVar64 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar81._16_16_ = auVar75;
  auVar81._0_16_ = auVar94._0_16_;
  auVar80._4_28_ = auVar81._4_28_;
  auVar80._0_4_ = auVar51._0_4_;
  auVar52 = vrsqrt14ss_avx512f(auVar94._0_16_,auVar80._0_16_);
  auVar69 = vmulss_avx512f(auVar52,ZEXT416(0x3fc00000));
  auVar70 = vmulss_avx512f(auVar51,ZEXT416(0xbf000000));
  auVar70 = vmulss_avx512f(auVar70,auVar52);
  auVar52 = vmulss_avx512f(auVar70,ZEXT416((uint)(auVar52._0_4_ * auVar52._0_4_)));
  auVar52 = vaddss_avx512f(auVar69,auVar52);
  auVar272._0_4_ = auVar52._0_4_;
  auVar272._4_4_ = auVar272._0_4_;
  auVar272._8_4_ = auVar272._0_4_;
  auVar272._12_4_ = auVar272._0_4_;
  auVar69 = vmulps_avx512vl(auVar53,auVar272);
  auVar52 = vdpps_avx(auVar53,auVar61,0x7f);
  auVar70 = vbroadcastss_avx512vl(auVar51);
  auVar61 = vmulps_avx512vl(auVar70,auVar61);
  fVar118 = auVar52._0_4_;
  auVar179._0_4_ = auVar53._0_4_ * fVar118;
  auVar179._4_4_ = auVar53._4_4_ * fVar118;
  auVar179._8_4_ = auVar53._8_4_ * fVar118;
  auVar179._12_4_ = auVar53._12_4_ * fVar118;
  auVar53 = vsubps_avx(auVar61,auVar179);
  auVar52 = vrcp14ss_avx512f(auVar94._0_16_,auVar80._0_16_);
  auVar51 = vfnmadd213ss_avx512f(auVar51,auVar52,ZEXT416(0x40000000));
  fVar127 = auVar52._0_4_ * auVar51._0_4_;
  auVar51 = vdpps_avx(auVar67,auVar67,0x7f);
  auVar82._16_16_ = auVar75;
  auVar82._0_16_ = auVar94._0_16_;
  auVar83._4_28_ = auVar82._4_28_;
  auVar83._0_4_ = auVar51._0_4_;
  auVar52 = vrsqrt14ss_avx512f(auVar94._0_16_,auVar83._0_16_);
  auVar61 = vmulss_avx512f(auVar52,ZEXT416(0x3fc00000));
  auVar71 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar70 = vmulss_avx512f(auVar51,ZEXT416(0xbf000000));
  auVar285 = ZEXT464(0x3f800000);
  fVar118 = auVar52._0_4_;
  fVar118 = auVar61._0_4_ + auVar70._0_4_ * fVar118 * fVar118 * fVar118;
  auVar266._0_4_ = auVar67._0_4_ * fVar118;
  auVar266._4_4_ = auVar67._4_4_ * fVar118;
  auVar266._8_4_ = auVar67._8_4_ * fVar118;
  auVar266._12_4_ = auVar67._12_4_ * fVar118;
  auVar52 = vdpps_avx(auVar67,auVar64,0x7f);
  auVar61 = vbroadcastss_avx512vl(auVar51);
  auVar61 = vmulps_avx512vl(auVar61,auVar64);
  fVar234 = auVar52._0_4_;
  auVar227._0_4_ = fVar234 * auVar67._0_4_;
  auVar227._4_4_ = fVar234 * auVar67._4_4_;
  auVar227._8_4_ = fVar234 * auVar67._8_4_;
  auVar227._12_4_ = fVar234 * auVar67._12_4_;
  auVar52 = vsubps_avx(auVar61,auVar227);
  auVar61 = vrcp14ss_avx512f(auVar94._0_16_,auVar83._0_16_);
  auVar51 = vfnmadd213ss_avx512f(auVar51,auVar61,ZEXT416(0x40000000));
  fVar234 = auVar51._0_4_ * auVar61._0_4_;
  auVar61 = vshufps_avx512vl(auVar60,auVar60,0xff);
  auVar67 = vmulps_avx512vl(auVar61,auVar69);
  auVar64 = vsubps_avx512vl(auVar60,auVar67);
  auVar51 = vshufps_avx(auVar62,auVar62,0xff);
  auVar51 = vmulps_avx512vl(auVar51,auVar69);
  auVar160._0_4_ = auVar51._0_4_ + auVar61._0_4_ * auVar272._0_4_ * fVar127 * auVar53._0_4_;
  auVar160._4_4_ = auVar51._4_4_ + auVar61._4_4_ * auVar272._0_4_ * fVar127 * auVar53._4_4_;
  auVar160._8_4_ = auVar51._8_4_ + auVar61._8_4_ * auVar272._0_4_ * fVar127 * auVar53._8_4_;
  auVar160._12_4_ = auVar51._12_4_ + auVar61._12_4_ * auVar272._0_4_ * fVar127 * auVar53._12_4_;
  auVar51 = vsubps_avx(auVar62,auVar160);
  auVar53 = vaddps_avx512vl(auVar60,auVar67);
  auVar61 = vshufps_avx512vl(auVar63,auVar63,0xff);
  auVar260._0_4_ = auVar61._0_4_ * auVar266._0_4_;
  auVar260._4_4_ = auVar61._4_4_ * auVar266._4_4_;
  auVar260._8_4_ = auVar61._8_4_ * auVar266._8_4_;
  auVar260._12_4_ = auVar61._12_4_ * auVar266._12_4_;
  auVar67 = vsubps_avx512vl(auVar63,auVar260);
  auVar69 = vshufps_avx512vl(auVar68,auVar68,0xff);
  auVar69 = vmulps_avx512vl(auVar69,auVar266);
  auVar180._0_4_ = auVar69._0_4_ + auVar61._0_4_ * fVar118 * auVar52._0_4_ * fVar234;
  auVar180._4_4_ = auVar69._4_4_ + auVar61._4_4_ * fVar118 * auVar52._4_4_ * fVar234;
  auVar180._8_4_ = auVar69._8_4_ + auVar61._8_4_ * fVar118 * auVar52._8_4_ * fVar234;
  auVar180._12_4_ = auVar69._12_4_ + auVar61._12_4_ * fVar118 * auVar52._12_4_ * fVar234;
  auVar52 = vsubps_avx512vl(auVar68,auVar180);
  auVar61 = vaddps_avx512vl(auVar63,auVar260);
  auVar68 = vaddps_avx512vl(auVar68,auVar180);
  auVar228._0_4_ = auVar64._0_4_ + auVar51._0_4_ * 0.33333334;
  auVar228._4_4_ = auVar64._4_4_ + auVar51._4_4_ * 0.33333334;
  auVar228._8_4_ = auVar64._8_4_ + auVar51._8_4_ * 0.33333334;
  auVar228._12_4_ = auVar64._12_4_ + auVar51._12_4_ * 0.33333334;
  auVar219._0_4_ = auVar52._0_4_ * 0.33333334;
  auVar219._4_4_ = auVar52._4_4_ * 0.33333334;
  auVar219._8_4_ = auVar52._8_4_ * 0.33333334;
  auVar219._12_4_ = auVar52._12_4_ * 0.33333334;
  auVar51 = vsubps_avx(auVar67,auVar219);
  auVar161._0_4_ = auVar53._0_4_ + (fVar243 + auVar160._0_4_) * 0.33333334;
  auVar161._4_4_ = auVar53._4_4_ + (fVar244 + auVar160._4_4_) * 0.33333334;
  auVar161._8_4_ = auVar53._8_4_ + (fVar145 + auVar160._8_4_) * 0.33333334;
  auVar161._12_4_ = auVar53._12_4_ + (fVar154 + auVar160._12_4_) * 0.33333334;
  auVar181._0_4_ = auVar68._0_4_ * 0.33333334;
  auVar181._4_4_ = auVar68._4_4_ * 0.33333334;
  auVar181._8_4_ = auVar68._8_4_ * 0.33333334;
  auVar181._12_4_ = auVar68._12_4_ * 0.33333334;
  auVar52 = vsubps_avx(auVar61,auVar181);
  auVar267._4_4_ = fVar248;
  auVar267._0_4_ = fVar248;
  auVar267._8_4_ = fVar248;
  auVar267._12_4_ = fVar248;
  auVar68 = vsubss_avx512f(ZEXT416(0x3f800000),ZEXT416((uint)fVar248));
  auVar121._0_4_ = auVar68._0_4_;
  auVar121._4_4_ = auVar121._0_4_;
  auVar121._8_4_ = auVar121._0_4_;
  auVar121._12_4_ = auVar121._0_4_;
  auVar64 = vmulps_avx512vl(auVar267,auVar64);
  auVar68 = vmulps_avx512vl(auVar267,auVar228);
  auVar51 = vmulps_avx512vl(auVar267,auVar51);
  auVar273._0_4_ = fVar248 * auVar67._0_4_;
  auVar273._4_4_ = fVar248 * auVar67._4_4_;
  auVar273._8_4_ = fVar248 * auVar67._8_4_;
  auVar273._12_4_ = fVar248 * auVar67._12_4_;
  local_330 = vfmadd231ps_avx512vl(auVar64,auVar121,auVar58);
  local_340 = vfmadd231ps_avx512vl(auVar68,auVar121,auVar194);
  local_350 = vfmadd231ps_avx512vl(auVar51,auVar121,auVar65);
  local_360 = vfmadd231ps_fma(auVar273,auVar121,auVar54);
  auVar51 = vmulps_avx512vl(auVar267,auVar53);
  auVar53 = vmulps_avx512vl(auVar267,auVar161);
  auVar52 = vmulps_avx512vl(auVar267,auVar52);
  auVar261._0_4_ = fVar248 * auVar61._0_4_;
  auVar261._4_4_ = fVar248 * auVar61._4_4_;
  auVar261._8_4_ = fVar248 * auVar61._8_4_;
  auVar261._12_4_ = fVar248 * auVar61._12_4_;
  _local_370 = vfmadd231ps_avx512vl(auVar51,auVar121,auVar56);
  _local_380 = vfmadd231ps_avx512vl(auVar53,auVar121,_local_540);
  _local_390 = vfmadd231ps_avx512vl(auVar52,auVar121,auVar66);
  _local_3a0 = vfmadd231ps_fma(auVar261,auVar121,auVar59);
  auVar51 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar51 = vinsertps_avx(auVar51,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar118 = *(float *)(ray + k * 4 + 0x60);
  local_2b0 = vsubps_avx512vl(local_330,auVar51);
  uVar119 = local_2b0._0_4_;
  auVar129._4_4_ = uVar119;
  auVar129._0_4_ = uVar119;
  auVar129._8_4_ = uVar119;
  auVar129._12_4_ = uVar119;
  auVar52 = vshufps_avx(local_2b0,local_2b0,0x55);
  auVar53 = vshufps_avx(local_2b0,local_2b0,0xaa);
  aVar4 = pre->ray_space[k].vx.field_0;
  aVar5 = pre->ray_space[k].vy.field_0;
  fVar127 = pre->ray_space[k].vz.field_0.m128[0];
  fVar248 = pre->ray_space[k].vz.field_0.m128[1];
  fVar234 = pre->ray_space[k].vz.field_0.m128[2];
  fVar243 = pre->ray_space[k].vz.field_0.m128[3];
  auVar122._0_4_ = fVar127 * auVar53._0_4_;
  auVar122._4_4_ = fVar248 * auVar53._4_4_;
  auVar122._8_4_ = fVar234 * auVar53._8_4_;
  auVar122._12_4_ = fVar243 * auVar53._12_4_;
  auVar52 = vfmadd231ps_fma(auVar122,(undefined1  [16])aVar5,auVar52);
  auVar64 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar4,auVar129);
  local_2c0 = vsubps_avx512vl(local_340,auVar51);
  uVar119 = local_2c0._0_4_;
  auVar134._4_4_ = uVar119;
  auVar134._0_4_ = uVar119;
  auVar134._8_4_ = uVar119;
  auVar134._12_4_ = uVar119;
  auVar52 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar53 = vshufps_avx(local_2c0,local_2c0,0xaa);
  auVar130._0_4_ = fVar127 * auVar53._0_4_;
  auVar130._4_4_ = fVar248 * auVar53._4_4_;
  auVar130._8_4_ = fVar234 * auVar53._8_4_;
  auVar130._12_4_ = fVar243 * auVar53._12_4_;
  auVar52 = vfmadd231ps_fma(auVar130,(undefined1  [16])aVar5,auVar52);
  auVar65 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar4,auVar134);
  local_2d0 = vsubps_avx512vl(local_350,auVar51);
  uVar119 = local_2d0._0_4_;
  auVar182._4_4_ = uVar119;
  auVar182._0_4_ = uVar119;
  auVar182._8_4_ = uVar119;
  auVar182._12_4_ = uVar119;
  auVar52 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar53 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar135._0_4_ = fVar127 * auVar53._0_4_;
  auVar135._4_4_ = fVar248 * auVar53._4_4_;
  auVar135._8_4_ = fVar234 * auVar53._8_4_;
  auVar135._12_4_ = fVar243 * auVar53._12_4_;
  auVar52 = vfmadd231ps_fma(auVar135,(undefined1  [16])aVar5,auVar52);
  auVar66 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar4,auVar182);
  local_2e0 = vsubps_avx(local_360,auVar51);
  uVar119 = local_2e0._0_4_;
  auVar205._4_4_ = uVar119;
  auVar205._0_4_ = uVar119;
  auVar205._8_4_ = uVar119;
  auVar205._12_4_ = uVar119;
  auVar52 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar53 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar183._0_4_ = fVar127 * auVar53._0_4_;
  auVar183._4_4_ = fVar248 * auVar53._4_4_;
  auVar183._8_4_ = fVar234 * auVar53._8_4_;
  auVar183._12_4_ = fVar243 * auVar53._12_4_;
  auVar52 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar5,auVar52);
  auVar68 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar4,auVar205);
  local_2f0 = vsubps_avx512vl(_local_370,auVar51);
  uVar119 = local_2f0._0_4_;
  auVar206._4_4_ = uVar119;
  auVar206._0_4_ = uVar119;
  auVar206._8_4_ = uVar119;
  auVar206._12_4_ = uVar119;
  auVar52 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar53 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar229._0_4_ = auVar53._0_4_ * fVar127;
  auVar229._4_4_ = auVar53._4_4_ * fVar248;
  auVar229._8_4_ = auVar53._8_4_ * fVar234;
  auVar229._12_4_ = auVar53._12_4_ * fVar243;
  auVar52 = vfmadd231ps_fma(auVar229,(undefined1  [16])aVar5,auVar52);
  auVar69 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar4,auVar206);
  local_300 = vsubps_avx512vl(_local_380,auVar51);
  uVar119 = local_300._0_4_;
  auVar207._4_4_ = uVar119;
  auVar207._0_4_ = uVar119;
  auVar207._8_4_ = uVar119;
  auVar207._12_4_ = uVar119;
  auVar52 = vshufps_avx(local_300,local_300,0x55);
  auVar53 = vshufps_avx(local_300,local_300,0xaa);
  auVar235._0_4_ = auVar53._0_4_ * fVar127;
  auVar235._4_4_ = auVar53._4_4_ * fVar248;
  auVar235._8_4_ = auVar53._8_4_ * fVar234;
  auVar235._12_4_ = auVar53._12_4_ * fVar243;
  auVar52 = vfmadd231ps_fma(auVar235,(undefined1  [16])aVar5,auVar52);
  auVar70 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar4,auVar207);
  local_310 = vsubps_avx512vl(_local_390,auVar51);
  uVar119 = local_310._0_4_;
  auVar208._4_4_ = uVar119;
  auVar208._0_4_ = uVar119;
  auVar208._8_4_ = uVar119;
  auVar208._12_4_ = uVar119;
  auVar52 = vshufps_avx(local_310,local_310,0x55);
  auVar53 = vshufps_avx(local_310,local_310,0xaa);
  auVar250._0_4_ = auVar53._0_4_ * fVar127;
  auVar250._4_4_ = auVar53._4_4_ * fVar248;
  auVar250._8_4_ = auVar53._8_4_ * fVar234;
  auVar250._12_4_ = auVar53._12_4_ * fVar243;
  auVar52 = vfmadd231ps_fma(auVar250,(undefined1  [16])aVar5,auVar52);
  auVar19 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar4,auVar208);
  local_320 = vsubps_avx(_local_3a0,auVar51);
  uVar119 = local_320._0_4_;
  auVar147._4_4_ = uVar119;
  auVar147._0_4_ = uVar119;
  auVar147._8_4_ = uVar119;
  auVar147._12_4_ = uVar119;
  auVar51 = vshufps_avx(local_320,local_320,0x55);
  auVar52 = vshufps_avx(local_320,local_320,0xaa);
  auVar195._0_4_ = auVar52._0_4_ * fVar127;
  auVar195._4_4_ = auVar52._4_4_ * fVar248;
  auVar195._8_4_ = auVar52._8_4_ * fVar234;
  auVar195._12_4_ = auVar52._12_4_ * fVar243;
  auVar51 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar5,auVar51);
  auVar20 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar4,auVar147);
  auVar53 = vmovlhps_avx(auVar64,auVar69);
  auVar61 = vmovlhps_avx(auVar65,auVar70);
  local_440 = vmovlhps_avx(auVar66,auVar19);
  _local_270 = vmovlhps_avx512f(auVar68,auVar20);
  auVar52 = vminps_avx(auVar53,auVar61);
  auVar51 = vmaxps_avx(auVar53,auVar61);
  auVar67 = vminps_avx512vl(local_440,_local_270);
  auVar52 = vminps_avx(auVar52,auVar67);
  auVar67 = vmaxps_avx512vl(local_440,_local_270);
  auVar51 = vmaxps_avx(auVar51,auVar67);
  auVar67 = vshufpd_avx(auVar52,auVar52,3);
  auVar52 = vminps_avx(auVar52,auVar67);
  auVar67 = vshufpd_avx(auVar51,auVar51,3);
  auVar51 = vmaxps_avx(auVar51,auVar67);
  auVar52 = vandps_avx512vl(auVar52,auVar283._0_16_);
  auVar51 = vandps_avx512vl(auVar51,auVar283._0_16_);
  auVar51 = vmaxps_avx(auVar52,auVar51);
  auVar52 = vmovshdup_avx(auVar51);
  auVar51 = vmaxss_avx(auVar52,auVar51);
  fVar127 = auVar51._0_4_ * 9.536743e-07;
  auVar52 = vmovddup_avx512vl(auVar64);
  auVar67 = vmovddup_avx512vl(auVar65);
  auVar64 = vmovddup_avx512vl(auVar66);
  auVar65 = vmovddup_avx512vl(auVar68);
  auVar131._4_4_ = fVar127;
  auVar131._0_4_ = fVar127;
  auVar131._8_4_ = fVar127;
  auVar131._12_4_ = fVar127;
  local_260._16_4_ = fVar127;
  local_260._0_16_ = auVar131;
  local_260._20_4_ = fVar127;
  local_260._24_4_ = fVar127;
  local_260._28_4_ = fVar127;
  auVar51 = vxorps_avx512vl(auVar131,auVar71);
  local_1c0 = auVar51._0_4_;
  uStack_1bc = local_1c0;
  uStack_1b8 = local_1c0;
  uStack_1b4 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1ac = local_1c0;
  uStack_1a8 = local_1c0;
  uStack_1a4 = local_1c0;
  uVar39 = 0;
  local_280 = vsubps_avx(auVar61,auVar53);
  local_290 = vsubps_avx(local_440,auVar61);
  local_2a0 = vsubps_avx512vl(_local_270,local_440);
  local_3b0 = vsubps_avx512vl(_local_370,local_330);
  local_3c0 = vsubps_avx512vl(_local_380,local_340);
  local_3d0 = vsubps_avx512vl(_local_390,local_350);
  _local_3e0 = vsubps_avx(_local_3a0,local_360);
  local_1e0 = vpbroadcastd_avx512vl();
  local_200 = vpbroadcastd_avx512vl();
  auVar51 = ZEXT816(0x3f80000000000000);
  auVar132 = auVar51;
LAB_01bc942d:
  do {
    auVar66 = vshufps_avx(auVar132,auVar132,0x50);
    auVar268._8_4_ = 0x3f800000;
    auVar268._0_8_ = 0x3f8000003f800000;
    auVar268._12_4_ = 0x3f800000;
    auVar271._16_4_ = 0x3f800000;
    auVar271._0_16_ = auVar268;
    auVar271._20_4_ = 0x3f800000;
    auVar271._24_4_ = 0x3f800000;
    auVar271._28_4_ = 0x3f800000;
    auVar68 = vsubps_avx(auVar268,auVar66);
    fVar248 = auVar66._0_4_;
    fVar145 = auVar69._0_4_;
    auVar148._0_4_ = fVar145 * fVar248;
    fVar234 = auVar66._4_4_;
    fVar154 = auVar69._4_4_;
    auVar148._4_4_ = fVar154 * fVar234;
    fVar243 = auVar66._8_4_;
    auVar148._8_4_ = fVar145 * fVar243;
    fVar244 = auVar66._12_4_;
    auVar148._12_4_ = fVar154 * fVar244;
    fVar155 = auVar70._0_4_;
    auVar162._0_4_ = fVar155 * fVar248;
    fVar172 = auVar70._4_4_;
    auVar162._4_4_ = fVar172 * fVar234;
    auVar162._8_4_ = fVar155 * fVar243;
    auVar162._12_4_ = fVar172 * fVar244;
    fVar173 = auVar19._0_4_;
    auVar184._0_4_ = fVar173 * fVar248;
    fVar191 = auVar19._4_4_;
    auVar184._4_4_ = fVar191 * fVar234;
    auVar184._8_4_ = fVar173 * fVar243;
    auVar184._12_4_ = fVar191 * fVar244;
    fVar192 = auVar20._0_4_;
    auVar136._0_4_ = fVar192 * fVar248;
    fVar200 = auVar20._4_4_;
    auVar136._4_4_ = fVar200 * fVar234;
    auVar136._8_4_ = fVar192 * fVar243;
    auVar136._12_4_ = fVar200 * fVar244;
    auVar71 = vfmadd231ps_avx512vl(auVar148,auVar68,auVar52);
    auVar72 = vfmadd231ps_avx512vl(auVar162,auVar68,auVar67);
    auVar54 = vfmadd231ps_avx512vl(auVar184,auVar68,auVar64);
    auVar68 = vfmadd231ps_avx512vl(auVar136,auVar65,auVar68);
    auVar66 = vmovshdup_avx(auVar51);
    fVar234 = auVar51._0_4_;
    fVar248 = (auVar66._0_4_ - fVar234) * 0.04761905;
    auVar151._4_4_ = fVar234;
    auVar151._0_4_ = fVar234;
    auVar151._8_4_ = fVar234;
    auVar151._12_4_ = fVar234;
    auVar151._16_4_ = fVar234;
    auVar151._20_4_ = fVar234;
    auVar151._24_4_ = fVar234;
    auVar151._28_4_ = fVar234;
    auVar89._0_8_ = auVar66._0_8_;
    auVar89._8_8_ = auVar89._0_8_;
    auVar89._16_8_ = auVar89._0_8_;
    auVar89._24_8_ = auVar89._0_8_;
    auVar97 = vsubps_avx(auVar89,auVar151);
    uVar119 = auVar71._0_4_;
    auVar99._4_4_ = uVar119;
    auVar99._0_4_ = uVar119;
    auVar99._8_4_ = uVar119;
    auVar99._12_4_ = uVar119;
    auVar99._16_4_ = uVar119;
    auVar99._20_4_ = uVar119;
    auVar99._24_4_ = uVar119;
    auVar99._28_4_ = uVar119;
    auVar92._8_4_ = 1;
    auVar92._0_8_ = 0x100000001;
    auVar92._12_4_ = 1;
    auVar92._16_4_ = 1;
    auVar92._20_4_ = 1;
    auVar92._24_4_ = 1;
    auVar92._28_4_ = 1;
    auVar96 = ZEXT1632(auVar71);
    auVar94 = vpermps_avx2(auVar92,auVar96);
    auVar79 = vbroadcastss_avx512vl(auVar72);
    auVar95 = ZEXT1632(auVar72);
    auVar80 = vpermps_avx512vl(auVar92,auVar95);
    auVar81 = vbroadcastss_avx512vl(auVar54);
    auVar90 = ZEXT1632(auVar54);
    auVar82 = vpermps_avx512vl(auVar92,auVar90);
    auVar83 = vbroadcastss_avx512vl(auVar68);
    auVar93 = ZEXT1632(auVar68);
    auVar84 = vpermps_avx512vl(auVar92,auVar93);
    auVar232._4_4_ = fVar248;
    auVar232._0_4_ = fVar248;
    auVar232._8_4_ = fVar248;
    auVar232._12_4_ = fVar248;
    auVar232._16_4_ = fVar248;
    auVar232._20_4_ = fVar248;
    auVar232._24_4_ = fVar248;
    auVar232._28_4_ = fVar248;
    auVar91._8_4_ = 2;
    auVar91._0_8_ = 0x200000002;
    auVar91._12_4_ = 2;
    auVar91._16_4_ = 2;
    auVar91._20_4_ = 2;
    auVar91._24_4_ = 2;
    auVar91._28_4_ = 2;
    auVar85 = vpermps_avx512vl(auVar91,auVar96);
    auVar86 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar87 = vpermps_avx512vl(auVar86,auVar96);
    auVar88 = vpermps_avx512vl(auVar91,auVar95);
    auVar89 = vpermps_avx512vl(auVar86,auVar95);
    auVar96 = vpermps_avx2(auVar91,auVar90);
    auVar90 = vpermps_avx512vl(auVar86,auVar90);
    auVar91 = vpermps_avx512vl(auVar91,auVar93);
    auVar92 = vpermps_avx512vl(auVar86,auVar93);
    auVar66 = vfmadd132ps_fma(auVar97,auVar151,_DAT_01faff20);
    auVar97 = vsubps_avx(auVar271,ZEXT1632(auVar66));
    auVar86 = vmulps_avx512vl(auVar79,ZEXT1632(auVar66));
    auVar95 = ZEXT1632(auVar66);
    auVar93 = vmulps_avx512vl(auVar80,auVar95);
    auVar68 = vfmadd231ps_fma(auVar86,auVar97,auVar99);
    auVar71 = vfmadd231ps_fma(auVar93,auVar97,auVar94);
    auVar86 = vmulps_avx512vl(auVar81,auVar95);
    auVar93 = vmulps_avx512vl(auVar82,auVar95);
    auVar79 = vfmadd231ps_avx512vl(auVar86,auVar97,auVar79);
    auVar80 = vfmadd231ps_avx512vl(auVar93,auVar97,auVar80);
    auVar86 = vmulps_avx512vl(auVar83,auVar95);
    auVar99 = ZEXT1632(auVar66);
    auVar84 = vmulps_avx512vl(auVar84,auVar99);
    auVar81 = vfmadd231ps_avx512vl(auVar86,auVar97,auVar81);
    auVar82 = vfmadd231ps_avx512vl(auVar84,auVar97,auVar82);
    fVar243 = auVar66._0_4_;
    fVar244 = auVar66._4_4_;
    auVar84._4_4_ = fVar244 * auVar79._4_4_;
    auVar84._0_4_ = fVar243 * auVar79._0_4_;
    fVar245 = auVar66._8_4_;
    auVar84._8_4_ = fVar245 * auVar79._8_4_;
    fVar246 = auVar66._12_4_;
    auVar84._12_4_ = fVar246 * auVar79._12_4_;
    auVar84._16_4_ = auVar79._16_4_ * 0.0;
    auVar84._20_4_ = auVar79._20_4_ * 0.0;
    auVar84._24_4_ = auVar79._24_4_ * 0.0;
    auVar84._28_4_ = fVar234;
    auVar86._4_4_ = fVar244 * auVar80._4_4_;
    auVar86._0_4_ = fVar243 * auVar80._0_4_;
    auVar86._8_4_ = fVar245 * auVar80._8_4_;
    auVar86._12_4_ = fVar246 * auVar80._12_4_;
    auVar86._16_4_ = auVar80._16_4_ * 0.0;
    auVar86._20_4_ = auVar80._20_4_ * 0.0;
    auVar86._24_4_ = auVar80._24_4_ * 0.0;
    auVar86._28_4_ = auVar94._28_4_;
    auVar68 = vfmadd231ps_fma(auVar84,auVar97,ZEXT1632(auVar68));
    auVar71 = vfmadd231ps_fma(auVar86,auVar97,ZEXT1632(auVar71));
    auVar98._0_4_ = fVar243 * auVar81._0_4_;
    auVar98._4_4_ = fVar244 * auVar81._4_4_;
    auVar98._8_4_ = fVar245 * auVar81._8_4_;
    auVar98._12_4_ = fVar246 * auVar81._12_4_;
    auVar98._16_4_ = auVar81._16_4_ * 0.0;
    auVar98._20_4_ = auVar81._20_4_ * 0.0;
    auVar98._24_4_ = auVar81._24_4_ * 0.0;
    auVar98._28_4_ = 0;
    auVar93._4_4_ = fVar244 * auVar82._4_4_;
    auVar93._0_4_ = fVar243 * auVar82._0_4_;
    auVar93._8_4_ = fVar245 * auVar82._8_4_;
    auVar93._12_4_ = fVar246 * auVar82._12_4_;
    auVar93._16_4_ = auVar82._16_4_ * 0.0;
    auVar93._20_4_ = auVar82._20_4_ * 0.0;
    auVar93._24_4_ = auVar82._24_4_ * 0.0;
    auVar93._28_4_ = auVar81._28_4_;
    auVar72 = vfmadd231ps_fma(auVar98,auVar97,auVar79);
    auVar54 = vfmadd231ps_fma(auVar93,auVar97,auVar80);
    auVar95._28_4_ = auVar80._28_4_;
    auVar95._0_28_ =
         ZEXT1628(CONCAT412(fVar246 * auVar54._12_4_,
                            CONCAT48(fVar245 * auVar54._8_4_,
                                     CONCAT44(fVar244 * auVar54._4_4_,fVar243 * auVar54._0_4_))));
    auVar55 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar246 * auVar72._12_4_,
                                                 CONCAT48(fVar245 * auVar72._8_4_,
                                                          CONCAT44(fVar244 * auVar72._4_4_,
                                                                   fVar243 * auVar72._0_4_)))),
                              auVar97,ZEXT1632(auVar68));
    auVar56 = vfmadd231ps_fma(auVar95,auVar97,ZEXT1632(auVar71));
    auVar94 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar68));
    auVar79 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar71));
    auVar80 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar94 = vmulps_avx512vl(auVar94,auVar80);
    auVar79 = vmulps_avx512vl(auVar79,auVar80);
    auVar168._0_4_ = fVar248 * auVar94._0_4_;
    auVar168._4_4_ = fVar248 * auVar94._4_4_;
    auVar168._8_4_ = fVar248 * auVar94._8_4_;
    auVar168._12_4_ = fVar248 * auVar94._12_4_;
    auVar168._16_4_ = fVar248 * auVar94._16_4_;
    auVar168._20_4_ = fVar248 * auVar94._20_4_;
    auVar168._24_4_ = fVar248 * auVar94._24_4_;
    auVar168._28_4_ = 0;
    auVar94 = vmulps_avx512vl(auVar232,auVar79);
    auVar71 = vxorps_avx512vl(auVar83._0_16_,auVar83._0_16_);
    auVar79 = vpermt2ps_avx512vl(ZEXT1632(auVar55),_DAT_01feed00,ZEXT1632(auVar71));
    auVar81 = vpermt2ps_avx512vl(ZEXT1632(auVar56),_DAT_01feed00,ZEXT1632(auVar71));
    auVar139._0_4_ = auVar168._0_4_ + auVar55._0_4_;
    auVar139._4_4_ = auVar168._4_4_ + auVar55._4_4_;
    auVar139._8_4_ = auVar168._8_4_ + auVar55._8_4_;
    auVar139._12_4_ = auVar168._12_4_ + auVar55._12_4_;
    auVar139._16_4_ = auVar168._16_4_ + 0.0;
    auVar139._20_4_ = auVar168._20_4_ + 0.0;
    auVar139._24_4_ = auVar168._24_4_ + 0.0;
    auVar139._28_4_ = 0;
    auVar98 = ZEXT1632(auVar71);
    auVar82 = vpermt2ps_avx512vl(auVar168,_DAT_01feed00,auVar98);
    auVar83 = vaddps_avx512vl(ZEXT1632(auVar56),auVar94);
    auVar84 = vpermt2ps_avx512vl(auVar94,_DAT_01feed00,auVar98);
    auVar94 = vsubps_avx(auVar79,auVar82);
    auVar82 = vsubps_avx512vl(auVar81,auVar84);
    auVar84 = vmulps_avx512vl(auVar88,auVar99);
    auVar86 = vmulps_avx512vl(auVar89,auVar99);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar97,auVar85);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar97,auVar87);
    auVar93 = vmulps_avx512vl(auVar96,auVar99);
    auVar95 = vmulps_avx512vl(auVar90,auVar99);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar97,auVar88);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar97,auVar89);
    auVar85 = vmulps_avx512vl(auVar91,auVar99);
    auVar87 = vmulps_avx512vl(auVar92,auVar99);
    auVar68 = vfmadd231ps_fma(auVar85,auVar97,auVar96);
    auVar96 = vfmadd231ps_avx512vl(auVar87,auVar97,auVar90);
    auVar85 = vmulps_avx512vl(auVar99,auVar93);
    auVar88 = ZEXT1632(auVar66);
    auVar87 = vmulps_avx512vl(auVar88,auVar95);
    auVar84 = vfmadd231ps_avx512vl(auVar85,auVar97,auVar84);
    auVar86 = vfmadd231ps_avx512vl(auVar87,auVar97,auVar86);
    auVar96 = vmulps_avx512vl(auVar88,auVar96);
    auVar93 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar246 * auVar68._12_4_,
                                            CONCAT48(fVar245 * auVar68._8_4_,
                                                     CONCAT44(fVar244 * auVar68._4_4_,
                                                              fVar243 * auVar68._0_4_)))),auVar97,
                         auVar93);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar97,auVar95);
    auVar85._4_4_ = fVar244 * auVar93._4_4_;
    auVar85._0_4_ = fVar243 * auVar93._0_4_;
    auVar85._8_4_ = fVar245 * auVar93._8_4_;
    auVar85._12_4_ = fVar246 * auVar93._12_4_;
    auVar85._16_4_ = auVar93._16_4_ * 0.0;
    auVar85._20_4_ = auVar93._20_4_ * 0.0;
    auVar85._24_4_ = auVar93._24_4_ * 0.0;
    auVar85._28_4_ = auVar90._28_4_;
    auVar95 = vmulps_avx512vl(auVar88,auVar96);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar97,auVar84);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar86,auVar97);
    auVar97 = vsubps_avx512vl(auVar93,auVar84);
    auVar96 = vsubps_avx512vl(auVar96,auVar86);
    auVar97 = vmulps_avx512vl(auVar97,auVar80);
    auVar96 = vmulps_avx512vl(auVar96,auVar80);
    fVar234 = fVar248 * auVar97._0_4_;
    fVar243 = fVar248 * auVar97._4_4_;
    auVar87._4_4_ = fVar243;
    auVar87._0_4_ = fVar234;
    fVar244 = fVar248 * auVar97._8_4_;
    auVar87._8_4_ = fVar244;
    fVar245 = fVar248 * auVar97._12_4_;
    auVar87._12_4_ = fVar245;
    fVar246 = fVar248 * auVar97._16_4_;
    auVar87._16_4_ = fVar246;
    fVar247 = fVar248 * auVar97._20_4_;
    auVar87._20_4_ = fVar247;
    fVar248 = fVar248 * auVar97._24_4_;
    auVar87._24_4_ = fVar248;
    auVar87._28_4_ = auVar97._28_4_;
    auVar96 = vmulps_avx512vl(auVar232,auVar96);
    auVar80 = vpermt2ps_avx512vl(auVar85,_DAT_01feed00,auVar98);
    auVar84 = vpermt2ps_avx512vl(auVar95,_DAT_01feed00,auVar98);
    auVar233._0_4_ = auVar85._0_4_ + fVar234;
    auVar233._4_4_ = auVar85._4_4_ + fVar243;
    auVar233._8_4_ = auVar85._8_4_ + fVar244;
    auVar233._12_4_ = auVar85._12_4_ + fVar245;
    auVar233._16_4_ = auVar85._16_4_ + fVar246;
    auVar233._20_4_ = auVar85._20_4_ + fVar247;
    auVar233._24_4_ = auVar85._24_4_ + fVar248;
    auVar233._28_4_ = auVar85._28_4_ + auVar97._28_4_;
    auVar97 = vpermt2ps_avx512vl(auVar87,_DAT_01feed00,ZEXT1632(auVar71));
    auVar86 = vaddps_avx512vl(auVar95,auVar96);
    auVar96 = vpermt2ps_avx512vl(auVar96,_DAT_01feed00,ZEXT1632(auVar71));
    auVar97 = vsubps_avx(auVar80,auVar97);
    auVar96 = vsubps_avx512vl(auVar84,auVar96);
    auVar151 = ZEXT1632(auVar55);
    auVar93 = vsubps_avx512vl(auVar85,auVar151);
    auVar168 = ZEXT1632(auVar56);
    auVar87 = vsubps_avx512vl(auVar95,auVar168);
    auVar88 = vsubps_avx512vl(auVar80,auVar79);
    auVar93 = vaddps_avx512vl(auVar93,auVar88);
    auVar88 = vsubps_avx512vl(auVar84,auVar81);
    auVar87 = vaddps_avx512vl(auVar87,auVar88);
    auVar88 = vmulps_avx512vl(auVar168,auVar93);
    auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar151,auVar87);
    auVar89 = vmulps_avx512vl(auVar83,auVar93);
    auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar139,auVar87);
    auVar90 = vmulps_avx512vl(auVar82,auVar93);
    auVar90 = vfnmadd231ps_avx512vl(auVar90,auVar94,auVar87);
    auVar91 = vmulps_avx512vl(auVar81,auVar93);
    auVar91 = vfnmadd231ps_avx512vl(auVar91,auVar79,auVar87);
    auVar92 = vmulps_avx512vl(auVar95,auVar93);
    auVar92 = vfnmadd231ps_avx512vl(auVar92,auVar85,auVar87);
    auVar98 = vmulps_avx512vl(auVar86,auVar93);
    auVar98 = vfnmadd231ps_avx512vl(auVar98,auVar233,auVar87);
    auVar99 = vmulps_avx512vl(auVar96,auVar93);
    auVar99 = vfnmadd231ps_avx512vl(auVar99,auVar97,auVar87);
    auVar93 = vmulps_avx512vl(auVar84,auVar93);
    auVar93 = vfnmadd231ps_avx512vl(auVar93,auVar80,auVar87);
    auVar87 = vminps_avx512vl(auVar88,auVar89);
    auVar88 = vmaxps_avx512vl(auVar88,auVar89);
    auVar89 = vminps_avx512vl(auVar90,auVar91);
    auVar87 = vminps_avx512vl(auVar87,auVar89);
    auVar89 = vmaxps_avx512vl(auVar90,auVar91);
    auVar88 = vmaxps_avx512vl(auVar88,auVar89);
    auVar89 = vminps_avx512vl(auVar92,auVar98);
    auVar90 = vmaxps_avx512vl(auVar92,auVar98);
    auVar91 = vminps_avx512vl(auVar99,auVar93);
    auVar89 = vminps_avx512vl(auVar89,auVar91);
    auVar87 = vminps_avx512vl(auVar87,auVar89);
    auVar93 = vmaxps_avx512vl(auVar99,auVar93);
    auVar93 = vmaxps_avx512vl(auVar90,auVar93);
    auVar93 = vmaxps_avx512vl(auVar88,auVar93);
    uVar17 = vcmpps_avx512vl(auVar87,local_260,2);
    auVar88._4_4_ = uStack_1bc;
    auVar88._0_4_ = local_1c0;
    auVar88._8_4_ = uStack_1b8;
    auVar88._12_4_ = uStack_1b4;
    auVar88._16_4_ = uStack_1b0;
    auVar88._20_4_ = uStack_1ac;
    auVar88._24_4_ = uStack_1a8;
    auVar88._28_4_ = uStack_1a4;
    uVar18 = vcmpps_avx512vl(auVar93,auVar88,5);
    bVar37 = (byte)uVar17 & (byte)uVar18 & 0x7f;
    if (bVar37 == 0) {
      auVar51 = vxorps_avx512vl(auVar93._0_16_,auVar93._0_16_);
      auVar279 = ZEXT1664(auVar51);
      auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar286 = ZEXT1664(auVar51);
      auVar97 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar280 = ZEXT3264(auVar97);
      auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar281 = ZEXT1664(auVar51);
      in_ZMM22 = ZEXT464(0x3a83126f);
      auVar282 = ZEXT3264(_DAT_01feed20);
      auVar90 = _DAT_01feed20;
    }
    else {
      auVar93 = vsubps_avx512vl(auVar79,auVar151);
      auVar87 = vsubps_avx512vl(auVar81,auVar168);
      auVar89 = vsubps_avx512vl(auVar80,auVar85);
      auVar93 = vaddps_avx512vl(auVar93,auVar89);
      auVar89 = vsubps_avx512vl(auVar84,auVar95);
      auVar87 = vaddps_avx512vl(auVar87,auVar89);
      auVar89 = vmulps_avx512vl(auVar168,auVar93);
      auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar87,auVar151);
      auVar83 = vmulps_avx512vl(auVar83,auVar93);
      auVar83 = vfnmadd213ps_avx512vl(auVar139,auVar87,auVar83);
      auVar82 = vmulps_avx512vl(auVar82,auVar93);
      auVar82 = vfnmadd213ps_avx512vl(auVar94,auVar87,auVar82);
      auVar94 = vmulps_avx512vl(auVar81,auVar93);
      auVar81 = vfnmadd231ps_avx512vl(auVar94,auVar87,auVar79);
      auVar94 = vmulps_avx512vl(auVar95,auVar93);
      auVar95 = vfnmadd231ps_avx512vl(auVar94,auVar87,auVar85);
      auVar94 = vmulps_avx512vl(auVar86,auVar93);
      auVar86 = vfnmadd213ps_avx512vl(auVar233,auVar87,auVar94);
      auVar94 = vmulps_avx512vl(auVar96,auVar93);
      auVar85 = vfnmadd213ps_avx512vl(auVar97,auVar87,auVar94);
      auVar97 = vmulps_avx512vl(auVar84,auVar93);
      auVar84 = vfnmadd231ps_avx512vl(auVar97,auVar80,auVar87);
      auVar94 = vminps_avx(auVar89,auVar83);
      auVar97 = vmaxps_avx(auVar89,auVar83);
      auVar79 = vminps_avx(auVar82,auVar81);
      auVar79 = vminps_avx(auVar94,auVar79);
      auVar94 = vmaxps_avx(auVar82,auVar81);
      auVar97 = vmaxps_avx(auVar97,auVar94);
      auVar96 = vminps_avx(auVar95,auVar86);
      auVar94 = vmaxps_avx(auVar95,auVar86);
      auVar80 = vminps_avx(auVar85,auVar84);
      auVar96 = vminps_avx(auVar96,auVar80);
      auVar96 = vminps_avx(auVar79,auVar96);
      auVar79 = vmaxps_avx(auVar85,auVar84);
      auVar94 = vmaxps_avx(auVar94,auVar79);
      auVar97 = vmaxps_avx(auVar97,auVar94);
      uVar17 = vcmpps_avx512vl(auVar97,auVar88,5);
      uVar18 = vcmpps_avx512vl(auVar96,local_260,2);
      bVar37 = bVar37 & (byte)uVar17 & (byte)uVar18;
      in_ZMM22 = ZEXT464(0x3a83126f);
      auVar282 = ZEXT3264(_DAT_01feed20);
      if (bVar37 != 0) {
        auStack_430[uVar39] = (uint)bVar37;
        uVar17 = vmovlps_avx(auVar51);
        (&uStack_240)[uVar39] = uVar17;
        uVar3 = vmovlps_avx(auVar132);
        auStack_1a0[uVar39] = uVar3;
        uVar39 = (ulong)((int)uVar39 + 1);
      }
      auVar51 = vxorps_avx512vl(auVar93._0_16_,auVar93._0_16_);
      auVar279 = ZEXT1664(auVar51);
      auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar286 = ZEXT1664(auVar51);
      auVar97 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar280 = ZEXT3264(auVar97);
      auVar90._16_16_ = auVar97._16_16_;
      auVar90._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar281 = ZEXT1664(auVar90._0_16_);
    }
LAB_01bc9983:
    do {
      do {
        do {
          auVar68 = auVar284._0_16_;
          auVar66 = auVar279._0_16_;
          auVar75 = auVar90._16_16_;
          if ((int)uVar39 == 0) {
            uVar119 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar26._4_4_ = uVar119;
            auVar26._0_4_ = uVar119;
            auVar26._8_4_ = uVar119;
            auVar26._12_4_ = uVar119;
            uVar17 = vcmpps_avx512vl(local_3f0,auVar26,2);
            uVar45 = (uint)uVar50 & (uint)uVar50 + 0xf & (uint)uVar17;
            uVar50 = (ulong)uVar45;
            if (uVar45 == 0) {
              return;
            }
            goto LAB_01bc88d2;
          }
          uVar38 = (int)uVar39 - 1;
          uVar40 = (ulong)uVar38;
          uVar116 = auStack_430[uVar40];
          auVar132._8_8_ = 0;
          auVar132._0_8_ = auStack_1a0[uVar40];
          uVar3 = 0;
          for (uVar44 = (ulong)uVar116; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000
              ) {
            uVar3 = uVar3 + 1;
          }
          uVar42 = uVar116 - 1 & uVar116;
          bVar48 = uVar42 == 0;
          auStack_430[uVar40] = uVar42;
          if (bVar48) {
            uVar39 = (ulong)uVar38;
          }
          auVar123._8_8_ = 0;
          auVar123._0_8_ = uVar3;
          auVar51 = vpunpcklqdq_avx(auVar123,ZEXT416((int)uVar3 + 1));
          auVar51 = vcvtqq2ps_avx512vl(auVar51);
          auVar51 = vmulps_avx512vl(auVar51,auVar281._0_16_);
          uVar119 = *(undefined4 *)((long)&uStack_240 + uVar40 * 8 + 4);
          auVar21._4_4_ = uVar119;
          auVar21._0_4_ = uVar119;
          auVar21._8_4_ = uVar119;
          auVar21._12_4_ = uVar119;
          auVar71 = vmulps_avx512vl(auVar51,auVar21);
          auVar51 = vsubps_avx512vl(auVar68,auVar51);
          uVar119 = *(undefined4 *)(&uStack_240 + uVar40);
          auVar22._4_4_ = uVar119;
          auVar22._0_4_ = uVar119;
          auVar22._8_4_ = uVar119;
          auVar22._12_4_ = uVar119;
          auVar51 = vfmadd231ps_avx512vl(auVar71,auVar51,auVar22);
          auVar71 = vmovshdup_avx(auVar51);
          fVar248 = auVar71._0_4_ - auVar51._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar248));
          if (uVar116 == 0 || bVar48) goto LAB_01bc942d;
          auVar71 = vshufps_avx(auVar132,auVar132,0x50);
          auVar72 = vucomiss_avx512f(ZEXT416((uint)fVar248));
          in_ZMM22 = ZEXT1664(auVar72);
          auVar55 = vsubps_avx512vl(auVar68,auVar71);
          fVar234 = auVar71._0_4_;
          auVar163._0_4_ = fVar234 * fVar145;
          fVar243 = auVar71._4_4_;
          auVar163._4_4_ = fVar243 * fVar154;
          fVar244 = auVar71._8_4_;
          auVar163._8_4_ = fVar244 * fVar145;
          fVar245 = auVar71._12_4_;
          auVar163._12_4_ = fVar245 * fVar154;
          auVar185._0_4_ = fVar234 * fVar155;
          auVar185._4_4_ = fVar243 * fVar172;
          auVar185._8_4_ = fVar244 * fVar155;
          auVar185._12_4_ = fVar245 * fVar172;
          auVar196._0_4_ = fVar234 * fVar173;
          auVar196._4_4_ = fVar243 * fVar191;
          auVar196._8_4_ = fVar244 * fVar173;
          auVar196._12_4_ = fVar245 * fVar191;
          auVar140._0_4_ = fVar234 * fVar192;
          auVar140._4_4_ = fVar243 * fVar200;
          auVar140._8_4_ = fVar244 * fVar192;
          auVar140._12_4_ = fVar245 * fVar200;
          auVar71 = vfmadd231ps_fma(auVar163,auVar55,auVar52);
          auVar72 = vfmadd231ps_fma(auVar185,auVar55,auVar67);
          auVar54 = vfmadd231ps_fma(auVar196,auVar55,auVar64);
          auVar56 = vfmadd231ps_avx512vl(auVar140,auVar65,auVar55);
          auVar152._16_16_ = auVar71;
          auVar152._0_16_ = auVar71;
          auVar169._16_16_ = auVar72;
          auVar169._0_16_ = auVar72;
          auVar190._16_16_ = auVar54;
          auVar190._0_16_ = auVar54;
          auVar94 = vpermps_avx512vl(auVar282._0_32_,ZEXT1632(auVar51));
          auVar97 = vsubps_avx(auVar169,auVar152);
          auVar72 = vfmadd213ps_fma(auVar97,auVar94,auVar152);
          auVar97 = vsubps_avx(auVar190,auVar169);
          auVar55 = vfmadd213ps_fma(auVar97,auVar94,auVar169);
          auVar71 = vsubps_avx(auVar56,auVar54);
          auVar170._16_16_ = auVar71;
          auVar170._0_16_ = auVar71;
          auVar71 = vfmadd213ps_fma(auVar170,auVar94,auVar190);
          auVar97 = vsubps_avx(ZEXT1632(auVar55),ZEXT1632(auVar72));
          auVar72 = vfmadd213ps_fma(auVar97,auVar94,ZEXT1632(auVar72));
          auVar97 = vsubps_avx(ZEXT1632(auVar71),ZEXT1632(auVar55));
          auVar71 = vfmadd213ps_fma(auVar97,auVar94,ZEXT1632(auVar55));
          auVar97 = vsubps_avx(ZEXT1632(auVar71),ZEXT1632(auVar72));
          auVar63 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar97,auVar94);
          auVar97 = vmulps_avx512vl(auVar97,auVar280._0_32_);
          auVar90._16_16_ = auVar97._16_16_;
          auVar71 = vmulss_avx512f(ZEXT416((uint)fVar248),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar234 = auVar71._0_4_;
          auVar197._0_8_ =
               CONCAT44(auVar63._4_4_ + fVar234 * auVar97._4_4_,
                        auVar63._0_4_ + fVar234 * auVar97._0_4_);
          auVar197._8_4_ = auVar63._8_4_ + fVar234 * auVar97._8_4_;
          auVar197._12_4_ = auVar63._12_4_ + fVar234 * auVar97._12_4_;
          auVar164._0_4_ = fVar234 * auVar97._16_4_;
          auVar164._4_4_ = fVar234 * auVar97._20_4_;
          auVar164._8_4_ = fVar234 * auVar97._24_4_;
          auVar164._12_4_ = fVar234 * auVar97._28_4_;
          auVar75 = vsubps_avx((undefined1  [16])0x0,auVar164);
          auVar56 = vshufpd_avx(auVar63,auVar63,3);
          auVar57 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar71 = vsubps_avx(auVar56,auVar63);
          auVar72 = vsubps_avx(auVar57,(undefined1  [16])0x0);
          auVar220._0_4_ = auVar71._0_4_ + auVar72._0_4_;
          auVar220._4_4_ = auVar71._4_4_ + auVar72._4_4_;
          auVar220._8_4_ = auVar71._8_4_ + auVar72._8_4_;
          auVar220._12_4_ = auVar71._12_4_ + auVar72._12_4_;
          auVar71 = vshufps_avx(auVar63,auVar63,0xb1);
          auVar72 = vshufps_avx(auVar197,auVar197,0xb1);
          auVar54 = vshufps_avx(auVar75,auVar75,0xb1);
          auVar55 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar269._4_4_ = auVar220._0_4_;
          auVar269._0_4_ = auVar220._0_4_;
          auVar269._8_4_ = auVar220._0_4_;
          auVar269._12_4_ = auVar220._0_4_;
          auVar58 = vshufps_avx(auVar220,auVar220,0x55);
          fVar234 = auVar58._0_4_;
          auVar230._0_4_ = auVar71._0_4_ * fVar234;
          fVar243 = auVar58._4_4_;
          auVar230._4_4_ = auVar71._4_4_ * fVar243;
          fVar244 = auVar58._8_4_;
          auVar230._8_4_ = auVar71._8_4_ * fVar244;
          fVar245 = auVar58._12_4_;
          auVar230._12_4_ = auVar71._12_4_ * fVar245;
          auVar236._0_4_ = auVar72._0_4_ * fVar234;
          auVar236._4_4_ = auVar72._4_4_ * fVar243;
          auVar236._8_4_ = auVar72._8_4_ * fVar244;
          auVar236._12_4_ = auVar72._12_4_ * fVar245;
          auVar251._0_4_ = auVar54._0_4_ * fVar234;
          auVar251._4_4_ = auVar54._4_4_ * fVar243;
          auVar251._8_4_ = auVar54._8_4_ * fVar244;
          auVar251._12_4_ = auVar54._12_4_ * fVar245;
          auVar221._0_4_ = auVar55._0_4_ * fVar234;
          auVar221._4_4_ = auVar55._4_4_ * fVar243;
          auVar221._8_4_ = auVar55._8_4_ * fVar244;
          auVar221._12_4_ = auVar55._12_4_ * fVar245;
          auVar71 = vfmadd231ps_fma(auVar230,auVar269,auVar63);
          auVar72 = vfmadd231ps_fma(auVar236,auVar269,auVar197);
          auVar60 = vfmadd231ps_fma(auVar251,auVar269,auVar75);
          auVar62 = vfmadd231ps_fma(auVar221,(undefined1  [16])0x0,auVar269);
          auVar58 = vshufpd_avx(auVar71,auVar71,1);
          auVar59 = vshufpd_avx(auVar72,auVar72,1);
          auVar73 = vshufpd_avx512vl(auVar60,auVar60,1);
          auVar74 = vshufpd_avx512vl(auVar62,auVar62,1);
          auVar54 = vminss_avx(auVar71,auVar72);
          auVar71 = vmaxss_avx(auVar72,auVar71);
          auVar55 = vminss_avx(auVar60,auVar62);
          auVar72 = vmaxss_avx(auVar62,auVar60);
          auVar54 = vminss_avx(auVar54,auVar55);
          auVar71 = vmaxss_avx(auVar72,auVar71);
          auVar55 = vminss_avx(auVar58,auVar59);
          auVar72 = vmaxss_avx(auVar59,auVar58);
          auVar58 = vminss_avx512f(auVar73,auVar74);
          auVar59 = vmaxss_avx512f(auVar74,auVar73);
          auVar72 = vmaxss_avx(auVar59,auVar72);
          auVar90._0_16_ = vminss_avx512f(auVar55,auVar58);
          vucomiss_avx512f(auVar54);
          fVar243 = auVar72._0_4_;
          fVar234 = auVar71._0_4_;
          if (4 < (uint)uVar39) {
            bVar49 = fVar243 == -0.0001;
            bVar46 = NAN(fVar243);
            if (fVar243 <= -0.0001) goto LAB_01bc9bb6;
            break;
          }
LAB_01bc9bb6:
          auVar55 = vucomiss_avx512f(auVar90._0_16_);
          bVar49 = fVar243 <= -0.0001;
          bVar47 = -0.0001 < fVar234;
          bVar46 = bVar49;
          if (!bVar49) break;
          uVar17 = vcmpps_avx512vl(auVar54,auVar55,5);
          uVar18 = vcmpps_avx512vl(auVar90._0_16_,auVar55,5);
          bVar37 = (byte)uVar17 & (byte)uVar18 & 1;
          bVar49 = bVar47 && bVar37 == 0;
          bVar46 = bVar47 && bVar37 == 0;
        } while (!bVar47 || bVar37 != 0);
        vcmpss_avx512f(auVar54,auVar66,1);
        auVar59 = auVar285._0_16_;
        uVar17 = vcmpss_avx512f(auVar71,auVar66,1);
        bVar47 = (bool)((byte)uVar17 & 1);
        auVar101._16_16_ = auVar90._16_16_;
        auVar101._0_16_ = auVar59;
        iVar117 = auVar285._0_4_;
        auVar100._4_28_ = auVar101._4_28_;
        auVar100._0_4_ = (float)((uint)bVar47 * -0x40800000 + (uint)!bVar47 * iVar117);
        vucomiss_avx512f(auVar100._0_16_);
        bVar46 = (bool)(!bVar49 | bVar46);
        bVar47 = bVar46 == false;
        auVar103._16_16_ = auVar90._16_16_;
        auVar103._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar102._4_28_ = auVar103._4_28_;
        auVar102._0_4_ = (uint)bVar46 * auVar279._0_4_ + (uint)!bVar46 * 0x7f800000;
        auVar58 = auVar102._0_16_;
        auVar105._16_16_ = auVar90._16_16_;
        auVar105._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar104._4_28_ = auVar105._4_28_;
        auVar104._0_4_ = (uint)bVar46 * auVar279._0_4_ + (uint)!bVar46 * -0x800000;
        auVar55 = auVar104._0_16_;
        uVar17 = vcmpss_avx512f(auVar90._0_16_,auVar66,1);
        bVar49 = (bool)((byte)uVar17 & 1);
        auVar107._16_16_ = auVar90._16_16_;
        auVar107._0_16_ = auVar59;
        auVar106._4_28_ = auVar107._4_28_;
        auVar106._0_4_ = (float)((uint)bVar49 * -0x40800000 + (uint)!bVar49 * iVar117);
        vucomiss_avx512f(auVar106._0_16_);
        if ((bVar46) || (bVar47)) {
          auVar60 = vucomiss_avx512f(auVar54);
          if ((bVar46) || (bVar47)) {
            auVar25._8_4_ = 0x80000000;
            auVar25._0_8_ = 0x8000000080000000;
            auVar25._12_4_ = 0x80000000;
            auVar62 = vxorps_avx512vl(auVar54,auVar25);
            auVar54 = vsubss_avx512f(auVar60,auVar54);
            auVar54 = vdivss_avx512f(auVar62,auVar54);
            auVar60 = vsubss_avx512f(auVar59,auVar54);
            auVar54 = vfmadd213ss_avx512f(auVar60,auVar66,auVar54);
            auVar60 = auVar54;
          }
          else {
            auVar60 = vxorps_avx512vl(auVar60,auVar60);
            vucomiss_avx512f(auVar60);
            if ((bVar46) || (auVar54 = auVar59, bVar47)) {
              auVar54 = SUB6416(ZEXT464(0xff800000),0);
              auVar60 = ZEXT416(0x7f800000);
            }
          }
          auVar58 = vminss_avx512f(auVar58,auVar60);
          auVar55 = vmaxss_avx(auVar54,auVar55);
        }
        uVar17 = vcmpss_avx512f(auVar72,auVar66,1);
        bVar49 = (bool)((byte)uVar17 & 1);
        fVar244 = (float)((uint)bVar49 * -0x40800000 + (uint)!bVar49 * iVar117);
        if ((auVar100._0_4_ != fVar244) || (NAN(auVar100._0_4_) || NAN(fVar244))) {
          if ((fVar243 != fVar234) || (NAN(fVar243) || NAN(fVar234))) {
            auVar24._8_4_ = 0x80000000;
            auVar24._0_8_ = 0x8000000080000000;
            auVar24._12_4_ = 0x80000000;
            auVar71 = vxorps_avx512vl(auVar71,auVar24);
            auVar222._0_4_ = auVar71._0_4_ / (fVar243 - fVar234);
            auVar222._4_12_ = auVar71._4_12_;
            auVar71 = vsubss_avx512f(auVar59,auVar222);
            auVar71 = vfmadd213ss_avx512f(auVar71,auVar66,auVar222);
            auVar72 = auVar71;
          }
          else if ((fVar234 != 0.0) ||
                  (auVar71 = auVar59, auVar72 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar234))) {
            auVar71 = SUB6416(ZEXT464(0xff800000),0);
            auVar72 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar58 = vminss_avx(auVar58,auVar72);
          auVar55 = vmaxss_avx(auVar71,auVar55);
        }
        bVar49 = auVar106._0_4_ != fVar244;
        auVar71 = vminss_avx512f(auVar58,auVar59);
        auVar109._16_16_ = auVar90._16_16_;
        auVar109._0_16_ = auVar58;
        auVar108._4_28_ = auVar109._4_28_;
        auVar108._0_4_ = (uint)bVar49 * auVar71._0_4_ + (uint)!bVar49 * auVar58._0_4_;
        auVar71 = vmaxss_avx512f(auVar59,auVar55);
        auVar111._16_16_ = auVar90._16_16_;
        auVar111._0_16_ = auVar55;
        auVar110._4_28_ = auVar111._4_28_;
        auVar110._0_4_ = (uint)bVar49 * auVar71._0_4_ + (uint)!bVar49 * auVar55._0_4_;
        auVar71 = vmaxss_avx512f(auVar66,auVar108._0_16_);
        auVar90._0_16_ = vminss_avx512f(auVar110._0_16_,auVar59);
      } while (auVar90._0_4_ < auVar71._0_4_);
      auVar55 = vmaxss_avx512f(auVar66,ZEXT416((uint)(auVar71._0_4_ + -0.1)));
      auVar60 = vminss_avx512f(ZEXT416((uint)(auVar90._0_4_ + 0.1)),auVar59);
      auVar141._0_8_ = auVar63._0_8_;
      auVar141._8_8_ = auVar141._0_8_;
      auVar237._8_8_ = auVar197._0_8_;
      auVar237._0_8_ = auVar197._0_8_;
      auVar252._8_8_ = auVar75._0_8_;
      auVar252._0_8_ = auVar75._0_8_;
      auVar71 = vshufpd_avx(auVar197,auVar197,3);
      auVar72 = vshufpd_avx(auVar75,auVar75,3);
      auVar54 = vshufps_avx(auVar55,auVar60,0);
      auVar75 = vsubps_avx512vl(auVar68,auVar54);
      fVar234 = auVar54._0_4_;
      auVar186._0_4_ = fVar234 * auVar56._0_4_;
      fVar243 = auVar54._4_4_;
      auVar186._4_4_ = fVar243 * auVar56._4_4_;
      fVar244 = auVar54._8_4_;
      auVar186._8_4_ = fVar244 * auVar56._8_4_;
      fVar245 = auVar54._12_4_;
      auVar186._12_4_ = fVar245 * auVar56._12_4_;
      auVar198._0_4_ = fVar234 * auVar71._0_4_;
      auVar198._4_4_ = fVar243 * auVar71._4_4_;
      auVar198._8_4_ = fVar244 * auVar71._8_4_;
      auVar198._12_4_ = fVar245 * auVar71._12_4_;
      auVar274._0_4_ = auVar72._0_4_ * fVar234;
      auVar274._4_4_ = auVar72._4_4_ * fVar243;
      auVar274._8_4_ = auVar72._8_4_ * fVar244;
      auVar274._12_4_ = auVar72._12_4_ * fVar245;
      auVar165._0_4_ = fVar234 * auVar57._0_4_;
      auVar165._4_4_ = fVar243 * auVar57._4_4_;
      auVar165._8_4_ = fVar244 * auVar57._8_4_;
      auVar165._12_4_ = fVar245 * auVar57._12_4_;
      auVar56 = vfmadd231ps_fma(auVar186,auVar75,auVar141);
      auVar57 = vfmadd231ps_fma(auVar198,auVar75,auVar237);
      auVar58 = vfmadd231ps_fma(auVar274,auVar75,auVar252);
      auVar75 = vfmadd231ps_fma(auVar165,auVar75,ZEXT816(0));
      auVar72 = vsubss_avx512f(auVar59,auVar55);
      auVar71 = vmovshdup_avx(auVar132);
      auVar73 = vfmadd231ss_fma(ZEXT416((uint)(auVar71._0_4_ * auVar55._0_4_)),auVar132,auVar72);
      auVar72 = vsubss_avx512f(auVar59,auVar60);
      auVar74 = vfmadd231ss_fma(ZEXT416((uint)(auVar71._0_4_ * auVar60._0_4_)),auVar132,auVar72);
      auVar60 = vdivss_avx512f(auVar59,ZEXT416((uint)fVar248));
      auVar71 = vsubps_avx(auVar57,auVar56);
      auVar62 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar54 = vmulps_avx512vl(auVar71,auVar62);
      auVar71 = vsubps_avx(auVar58,auVar57);
      auVar55 = vmulps_avx512vl(auVar71,auVar62);
      auVar71 = vsubps_avx(auVar75,auVar58);
      auVar71 = vmulps_avx512vl(auVar71,auVar62);
      auVar72 = vminps_avx(auVar55,auVar71);
      auVar71 = vmaxps_avx(auVar55,auVar71);
      auVar72 = vminps_avx(auVar54,auVar72);
      auVar71 = vmaxps_avx(auVar54,auVar71);
      auVar54 = vshufpd_avx(auVar72,auVar72,3);
      auVar55 = vshufpd_avx(auVar71,auVar71,3);
      auVar72 = vminps_avx(auVar72,auVar54);
      auVar71 = vmaxps_avx(auVar71,auVar55);
      fVar248 = auVar60._0_4_;
      auVar223._0_4_ = auVar72._0_4_ * fVar248;
      auVar223._4_4_ = auVar72._4_4_ * fVar248;
      auVar223._8_4_ = auVar72._8_4_ * fVar248;
      auVar223._12_4_ = auVar72._12_4_ * fVar248;
      auVar209._0_4_ = fVar248 * auVar71._0_4_;
      auVar209._4_4_ = fVar248 * auVar71._4_4_;
      auVar209._8_4_ = fVar248 * auVar71._8_4_;
      auVar209._12_4_ = fVar248 * auVar71._12_4_;
      auVar60 = vdivss_avx512f(auVar59,ZEXT416((uint)(auVar74._0_4_ - auVar73._0_4_)));
      auVar71 = vshufpd_avx(auVar56,auVar56,3);
      auVar72 = vshufpd_avx(auVar57,auVar57,3);
      auVar54 = vshufpd_avx(auVar58,auVar58,3);
      auVar55 = vshufpd_avx(auVar75,auVar75,3);
      auVar71 = vsubps_avx(auVar71,auVar56);
      auVar56 = vsubps_avx(auVar72,auVar57);
      auVar57 = vsubps_avx(auVar54,auVar58);
      auVar55 = vsubps_avx(auVar55,auVar75);
      auVar72 = vminps_avx(auVar71,auVar56);
      auVar71 = vmaxps_avx(auVar71,auVar56);
      auVar54 = vminps_avx(auVar57,auVar55);
      auVar54 = vminps_avx(auVar72,auVar54);
      auVar72 = vmaxps_avx(auVar57,auVar55);
      auVar71 = vmaxps_avx(auVar71,auVar72);
      fVar248 = auVar60._0_4_;
      auVar253._0_4_ = fVar248 * auVar54._0_4_;
      auVar253._4_4_ = fVar248 * auVar54._4_4_;
      auVar253._8_4_ = fVar248 * auVar54._8_4_;
      auVar253._12_4_ = fVar248 * auVar54._12_4_;
      auVar238._0_4_ = fVar248 * auVar71._0_4_;
      auVar238._4_4_ = fVar248 * auVar71._4_4_;
      auVar238._8_4_ = fVar248 * auVar71._8_4_;
      auVar238._12_4_ = fVar248 * auVar71._12_4_;
      auVar55 = vinsertps_avx(auVar51,auVar73,0x10);
      auVar76 = vpermt2ps_avx512vl(auVar51,_DAT_01feecd0,auVar74);
      auVar133._0_4_ = auVar55._0_4_ + auVar76._0_4_;
      auVar133._4_4_ = auVar55._4_4_ + auVar76._4_4_;
      auVar133._8_4_ = auVar55._8_4_ + auVar76._8_4_;
      auVar133._12_4_ = auVar55._12_4_ + auVar76._12_4_;
      auVar60 = vmulps_avx512vl(auVar133,auVar286._0_16_);
      auVar72 = vshufps_avx(auVar60,auVar60,0x54);
      uVar119 = auVar60._0_4_;
      auVar137._4_4_ = uVar119;
      auVar137._0_4_ = uVar119;
      auVar137._8_4_ = uVar119;
      auVar137._12_4_ = uVar119;
      auVar57 = vfmadd213ps_avx512vl(local_280,auVar137,auVar53);
      auVar54 = vfmadd213ps_fma(local_290,auVar137,auVar61);
      auVar56 = vfmadd213ps_fma(local_2a0,auVar137,local_440);
      auVar71 = vsubps_avx(auVar54,auVar57);
      auVar57 = vfmadd213ps_fma(auVar71,auVar137,auVar57);
      auVar71 = vsubps_avx(auVar56,auVar54);
      auVar71 = vfmadd213ps_fma(auVar71,auVar137,auVar54);
      auVar71 = vsubps_avx(auVar71,auVar57);
      auVar54 = vfmadd231ps_fma(auVar57,auVar71,auVar137);
      auVar58 = vmulps_avx512vl(auVar71,auVar62);
      auVar262._8_8_ = auVar54._0_8_;
      auVar262._0_8_ = auVar54._0_8_;
      auVar71 = vshufpd_avx(auVar54,auVar54,3);
      auVar54 = vshufps_avx(auVar60,auVar60,0x55);
      auVar56 = vsubps_avx(auVar71,auVar262);
      auVar57 = vfmadd231ps_fma(auVar262,auVar54,auVar56);
      auVar275._8_8_ = auVar58._0_8_;
      auVar275._0_8_ = auVar58._0_8_;
      auVar71 = vshufpd_avx(auVar58,auVar58,3);
      auVar71 = vsubps_avx512vl(auVar71,auVar275);
      auVar71 = vfmadd213ps_avx512vl(auVar71,auVar54,auVar275);
      auVar138._0_8_ = auVar56._0_8_ ^ 0x8000000080000000;
      auVar138._8_4_ = auVar56._8_4_ ^ 0x80000000;
      auVar138._12_4_ = auVar56._12_4_ ^ 0x80000000;
      auVar54 = vmovshdup_avx512vl(auVar71);
      auVar276._0_8_ = auVar54._0_8_ ^ 0x8000000080000000;
      auVar276._8_4_ = auVar54._8_4_ ^ 0x80000000;
      auVar276._12_4_ = auVar54._12_4_ ^ 0x80000000;
      auVar58 = vmovshdup_avx512vl(auVar56);
      auVar75 = vpermt2ps_avx512vl(auVar276,ZEXT416(5),auVar56);
      auVar54 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar54._0_4_ * auVar56._0_4_)),auVar71,auVar58);
      auVar56 = vpermt2ps_avx512vl(auVar71,SUB6416(ZEXT464(4),0),auVar138);
      auVar166._0_4_ = auVar54._0_4_;
      auVar166._4_4_ = auVar166._0_4_;
      auVar166._8_4_ = auVar166._0_4_;
      auVar166._12_4_ = auVar166._0_4_;
      auVar71 = vdivps_avx(auVar75,auVar166);
      auVar77 = vdivps_avx512vl(auVar56,auVar166);
      fVar248 = auVar57._0_4_;
      auVar54 = vshufps_avx(auVar57,auVar57,0x55);
      auVar263._0_4_ = fVar248 * auVar71._0_4_ + auVar54._0_4_ * auVar77._0_4_;
      auVar263._4_4_ = fVar248 * auVar71._4_4_ + auVar54._4_4_ * auVar77._4_4_;
      auVar263._8_4_ = fVar248 * auVar71._8_4_ + auVar54._8_4_ * auVar77._8_4_;
      auVar263._12_4_ = fVar248 * auVar71._12_4_ + auVar54._12_4_ * auVar77._12_4_;
      auVar62 = vsubps_avx(auVar72,auVar263);
      auVar54 = vmovshdup_avx(auVar71);
      auVar72 = vinsertps_avx(auVar223,auVar253,0x1c);
      auVar277._0_4_ = auVar54._0_4_ * auVar72._0_4_;
      auVar277._4_4_ = auVar54._4_4_ * auVar72._4_4_;
      auVar277._8_4_ = auVar54._8_4_ * auVar72._8_4_;
      auVar277._12_4_ = auVar54._12_4_ * auVar72._12_4_;
      auVar63 = vinsertps_avx512f(auVar209,auVar238,0x1c);
      auVar54 = vmulps_avx512vl(auVar54,auVar63);
      auVar75 = vminps_avx512vl(auVar277,auVar54);
      auVar57 = vmaxps_avx(auVar54,auVar277);
      auVar58 = vmovshdup_avx(auVar77);
      auVar54 = vinsertps_avx(auVar253,auVar223,0x4c);
      auVar254._0_4_ = auVar58._0_4_ * auVar54._0_4_;
      auVar254._4_4_ = auVar58._4_4_ * auVar54._4_4_;
      auVar254._8_4_ = auVar58._8_4_ * auVar54._8_4_;
      auVar254._12_4_ = auVar58._12_4_ * auVar54._12_4_;
      auVar56 = vinsertps_avx(auVar238,auVar209,0x4c);
      auVar239._0_4_ = auVar58._0_4_ * auVar56._0_4_;
      auVar239._4_4_ = auVar58._4_4_ * auVar56._4_4_;
      auVar239._8_4_ = auVar58._8_4_ * auVar56._8_4_;
      auVar239._12_4_ = auVar58._12_4_ * auVar56._12_4_;
      auVar58 = vminps_avx(auVar254,auVar239);
      auVar75 = vaddps_avx512vl(auVar75,auVar58);
      auVar58 = vmaxps_avx(auVar239,auVar254);
      auVar240._0_4_ = auVar57._0_4_ + auVar58._0_4_;
      auVar240._4_4_ = auVar57._4_4_ + auVar58._4_4_;
      auVar240._8_4_ = auVar57._8_4_ + auVar58._8_4_;
      auVar240._12_4_ = auVar57._12_4_ + auVar58._12_4_;
      auVar255._8_8_ = 0x3f80000000000000;
      auVar255._0_8_ = 0x3f80000000000000;
      auVar57 = vsubps_avx(auVar255,auVar240);
      auVar58 = vsubps_avx(auVar255,auVar75);
      auVar75 = vsubps_avx(auVar55,auVar60);
      auVar60 = vsubps_avx(auVar76,auVar60);
      fVar245 = auVar75._0_4_;
      auVar278._0_4_ = fVar245 * auVar57._0_4_;
      fVar246 = auVar75._4_4_;
      auVar278._4_4_ = fVar246 * auVar57._4_4_;
      fVar247 = auVar75._8_4_;
      auVar278._8_4_ = fVar247 * auVar57._8_4_;
      fVar201 = auVar75._12_4_;
      auVar278._12_4_ = fVar201 * auVar57._12_4_;
      auVar78 = vbroadcastss_avx512vl(auVar71);
      auVar72 = vmulps_avx512vl(auVar78,auVar72);
      auVar63 = vmulps_avx512vl(auVar78,auVar63);
      auVar78 = vminps_avx512vl(auVar72,auVar63);
      auVar63 = vmaxps_avx512vl(auVar63,auVar72);
      auVar72 = vbroadcastss_avx512vl(auVar77);
      auVar54 = vmulps_avx512vl(auVar72,auVar54);
      auVar72 = vmulps_avx512vl(auVar72,auVar56);
      auVar56 = vminps_avx512vl(auVar54,auVar72);
      auVar56 = vaddps_avx512vl(auVar78,auVar56);
      auVar75 = vmulps_avx512vl(auVar75,auVar58);
      fVar248 = auVar60._0_4_;
      auVar241._0_4_ = fVar248 * auVar57._0_4_;
      fVar234 = auVar60._4_4_;
      auVar241._4_4_ = fVar234 * auVar57._4_4_;
      fVar243 = auVar60._8_4_;
      auVar241._8_4_ = fVar243 * auVar57._8_4_;
      fVar244 = auVar60._12_4_;
      auVar241._12_4_ = fVar244 * auVar57._12_4_;
      auVar256._0_4_ = fVar248 * auVar58._0_4_;
      auVar256._4_4_ = fVar234 * auVar58._4_4_;
      auVar256._8_4_ = fVar243 * auVar58._8_4_;
      auVar256._12_4_ = fVar244 * auVar58._12_4_;
      auVar72 = vmaxps_avx(auVar72,auVar54);
      auVar210._0_4_ = auVar63._0_4_ + auVar72._0_4_;
      auVar210._4_4_ = auVar63._4_4_ + auVar72._4_4_;
      auVar210._8_4_ = auVar63._8_4_ + auVar72._8_4_;
      auVar210._12_4_ = auVar63._12_4_ + auVar72._12_4_;
      auVar224._8_8_ = 0x3f800000;
      auVar224._0_8_ = 0x3f800000;
      auVar72 = vsubps_avx(auVar224,auVar210);
      auVar54 = vsubps_avx512vl(auVar224,auVar56);
      auVar270._0_4_ = fVar245 * auVar72._0_4_;
      auVar270._4_4_ = fVar246 * auVar72._4_4_;
      auVar270._8_4_ = fVar247 * auVar72._8_4_;
      auVar270._12_4_ = fVar201 * auVar72._12_4_;
      auVar264._0_4_ = fVar245 * auVar54._0_4_;
      auVar264._4_4_ = fVar246 * auVar54._4_4_;
      auVar264._8_4_ = fVar247 * auVar54._8_4_;
      auVar264._12_4_ = fVar201 * auVar54._12_4_;
      auVar211._0_4_ = fVar248 * auVar72._0_4_;
      auVar211._4_4_ = fVar234 * auVar72._4_4_;
      auVar211._8_4_ = fVar243 * auVar72._8_4_;
      auVar211._12_4_ = fVar244 * auVar72._12_4_;
      auVar225._0_4_ = fVar248 * auVar54._0_4_;
      auVar225._4_4_ = fVar234 * auVar54._4_4_;
      auVar225._8_4_ = fVar243 * auVar54._8_4_;
      auVar225._12_4_ = fVar244 * auVar54._12_4_;
      auVar72 = vminps_avx(auVar270,auVar264);
      auVar54 = vminps_avx512vl(auVar211,auVar225);
      auVar56 = vminps_avx512vl(auVar72,auVar54);
      auVar72 = vmaxps_avx(auVar264,auVar270);
      auVar54 = vmaxps_avx(auVar225,auVar211);
      auVar54 = vmaxps_avx(auVar54,auVar72);
      auVar57 = vminps_avx512vl(auVar278,auVar75);
      auVar72 = vminps_avx(auVar241,auVar256);
      auVar72 = vminps_avx(auVar57,auVar72);
      auVar72 = vhaddps_avx(auVar56,auVar72);
      auVar90._0_16_ = vmaxps_avx512vl(auVar75,auVar278);
      auVar56 = vmaxps_avx(auVar256,auVar241);
      auVar56 = vmaxps_avx(auVar56,auVar90._0_16_);
      auVar54 = vhaddps_avx(auVar54,auVar56);
      auVar72 = vshufps_avx(auVar72,auVar72,0xe8);
      auVar54 = vshufps_avx(auVar54,auVar54,0xe8);
      auVar212._0_4_ = auVar72._0_4_ + auVar62._0_4_;
      auVar212._4_4_ = auVar72._4_4_ + auVar62._4_4_;
      auVar212._8_4_ = auVar72._8_4_ + auVar62._8_4_;
      auVar212._12_4_ = auVar72._12_4_ + auVar62._12_4_;
      auVar226._0_4_ = auVar54._0_4_ + auVar62._0_4_;
      auVar226._4_4_ = auVar54._4_4_ + auVar62._4_4_;
      auVar226._8_4_ = auVar54._8_4_ + auVar62._8_4_;
      auVar226._12_4_ = auVar54._12_4_ + auVar62._12_4_;
      auVar72 = vmaxps_avx(auVar55,auVar212);
      auVar54 = vminps_avx(auVar226,auVar76);
      uVar3 = vcmpps_avx512vl(auVar54,auVar72,1);
    } while ((uVar3 & 3) != 0);
    uVar3 = vcmpps_avx512vl(auVar226,auVar76,1);
    uVar17 = vcmpps_avx512vl(auVar51,auVar212,1);
    if (((ushort)uVar17 & (ushort)uVar3 & 1) == 0) {
      bVar37 = 0;
    }
    else {
      auVar72 = vmovshdup_avx(auVar212);
      bVar37 = auVar73._0_4_ < auVar72._0_4_ & (byte)(uVar3 >> 1) & 0x7f;
    }
    if (((3 < (uint)uVar39 || uVar116 != 0 && !bVar48) | bVar37) == 1) {
      lVar41 = 200;
      do {
        auVar51 = vsubss_avx512f(auVar59,auVar62);
        fVar243 = auVar51._0_4_;
        fVar248 = fVar243 * fVar243 * fVar243;
        auVar51 = vmulss_avx512f(auVar62,ZEXT416(0x40400000));
        fVar234 = auVar51._0_4_ * fVar243 * fVar243;
        fVar244 = auVar62._0_4_;
        auVar51 = vmulss_avx512f(ZEXT416((uint)(fVar244 * fVar244)),ZEXT416(0x40400000));
        fVar243 = fVar243 * auVar51._0_4_;
        auVar149._4_4_ = fVar248;
        auVar149._0_4_ = fVar248;
        auVar149._8_4_ = fVar248;
        auVar149._12_4_ = fVar248;
        auVar142._4_4_ = fVar234;
        auVar142._0_4_ = fVar234;
        auVar142._8_4_ = fVar234;
        auVar142._12_4_ = fVar234;
        auVar124._4_4_ = fVar243;
        auVar124._0_4_ = fVar243;
        auVar124._8_4_ = fVar243;
        auVar124._12_4_ = fVar243;
        fVar244 = fVar244 * fVar244 * fVar244;
        auVar187._0_4_ = (float)local_270._0_4_ * fVar244;
        auVar187._4_4_ = (float)local_270._4_4_ * fVar244;
        auVar187._8_4_ = fStack_268 * fVar244;
        auVar187._12_4_ = fStack_264 * fVar244;
        auVar51 = vfmadd231ps_fma(auVar187,local_440,auVar124);
        auVar51 = vfmadd231ps_fma(auVar51,auVar61,auVar142);
        auVar51 = vfmadd231ps_fma(auVar51,auVar53,auVar149);
        auVar125._8_8_ = auVar51._0_8_;
        auVar125._0_8_ = auVar51._0_8_;
        auVar51 = vshufpd_avx(auVar51,auVar51,3);
        auVar72 = vshufps_avx(auVar62,auVar62,0x55);
        auVar51 = vsubps_avx(auVar51,auVar125);
        auVar72 = vfmadd213ps_fma(auVar51,auVar72,auVar125);
        fVar248 = auVar72._0_4_;
        auVar51 = vshufps_avx(auVar72,auVar72,0x55);
        auVar126._0_4_ = auVar71._0_4_ * fVar248 + auVar77._0_4_ * auVar51._0_4_;
        auVar126._4_4_ = auVar71._4_4_ * fVar248 + auVar77._4_4_ * auVar51._4_4_;
        auVar126._8_4_ = auVar71._8_4_ * fVar248 + auVar77._8_4_ * auVar51._8_4_;
        auVar126._12_4_ = auVar71._12_4_ * fVar248 + auVar77._12_4_ * auVar51._12_4_;
        auVar62 = vsubps_avx(auVar62,auVar126);
        auVar51 = vandps_avx512vl(auVar72,auVar283._0_16_);
        auVar90._0_16_ = vprolq_avx512vl(auVar51,0x20);
        auVar51 = vmaxss_avx(auVar90._0_16_,auVar51);
        bVar48 = fVar127 < auVar51._0_4_;
        if (auVar51._0_4_ < fVar127) {
          auVar51 = vucomiss_avx512f(auVar66);
          if (bVar48) break;
          auVar71 = vucomiss_avx512f(auVar51);
          auVar285 = ZEXT1664(auVar71);
          if (bVar48) break;
          vmovshdup_avx(auVar51);
          auVar71 = vucomiss_avx512f(auVar66);
          if (bVar48) break;
          auVar72 = vucomiss_avx512f(auVar71);
          auVar285 = ZEXT1664(auVar72);
          if (bVar48) break;
          auVar54 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                  ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
          auVar60 = vinsertps_avx(auVar54,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
          auVar54 = vdpps_avx(auVar60,local_2b0,0x7f);
          auVar55 = vdpps_avx(auVar60,local_2c0,0x7f);
          auVar56 = vdpps_avx(auVar60,local_2d0,0x7f);
          auVar57 = vdpps_avx(auVar60,local_2e0,0x7f);
          auVar58 = vdpps_avx(auVar60,local_2f0,0x7f);
          auVar59 = vdpps_avx(auVar60,local_300,0x7f);
          auVar75 = vdpps_avx(auVar60,local_310,0x7f);
          auVar60 = vdpps_avx(auVar60,local_320,0x7f);
          auVar62 = vsubss_avx512f(auVar72,auVar71);
          fVar244 = auVar71._0_4_;
          auVar71 = vfmadd231ss_fma(ZEXT416((uint)(fVar244 * auVar58._0_4_)),auVar62,auVar54);
          auVar54 = vfmadd231ss_fma(ZEXT416((uint)(auVar59._0_4_ * fVar244)),auVar62,auVar55);
          auVar55 = vfmadd231ss_fma(ZEXT416((uint)(auVar75._0_4_ * fVar244)),auVar62,auVar56);
          auVar56 = vfmadd231ss_fma(ZEXT416((uint)(fVar244 * auVar60._0_4_)),auVar62,auVar57);
          auVar72 = vsubss_avx512f(auVar72,auVar51);
          auVar199._0_4_ = auVar72._0_4_;
          fVar248 = auVar199._0_4_ * auVar199._0_4_ * auVar199._0_4_;
          auVar72 = vmulss_avx512f(auVar51,ZEXT416(0x40400000));
          fVar234 = auVar72._0_4_ * auVar199._0_4_ * auVar199._0_4_;
          local_120 = auVar51._0_4_;
          auVar188._0_4_ = local_120 * local_120;
          auVar188._4_4_ = auVar51._4_4_ * auVar51._4_4_;
          auVar188._8_4_ = auVar51._8_4_ * auVar51._8_4_;
          auVar188._12_4_ = auVar51._12_4_ * auVar51._12_4_;
          auVar90._0_16_ = vmulss_avx512f(auVar188,ZEXT416(0x40400000));
          fVar243 = auVar199._0_4_ * auVar90._0_4_;
          fVar246 = local_120 * auVar188._0_4_;
          auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar246 * auVar56._0_4_)),ZEXT416((uint)fVar243),
                                    auVar55);
          auVar72 = vfmadd231ss_fma(auVar72,ZEXT416((uint)fVar234),auVar54);
          auVar71 = vfmadd231ss_fma(auVar72,ZEXT416((uint)fVar248),auVar71);
          fVar245 = auVar71._0_4_;
          if ((fVar245 < fVar118) || (fVar247 = *(float *)(ray + k * 4 + 0x100), fVar247 < fVar245))
          break;
          auVar71 = vshufps_avx(auVar51,auVar51,0x55);
          auVar54 = vsubps_avx512vl(auVar68,auVar71);
          fVar201 = auVar71._0_4_;
          auVar231._0_4_ = fVar201 * (float)local_370._0_4_;
          fVar216 = auVar71._4_4_;
          auVar231._4_4_ = fVar216 * (float)local_370._4_4_;
          fVar217 = auVar71._8_4_;
          auVar231._8_4_ = fVar217 * fStack_368;
          fVar218 = auVar71._12_4_;
          auVar231._12_4_ = fVar218 * fStack_364;
          auVar242._0_4_ = fVar201 * (float)local_380._0_4_;
          auVar242._4_4_ = fVar216 * (float)local_380._4_4_;
          auVar242._8_4_ = fVar217 * fStack_378;
          auVar242._12_4_ = fVar218 * fStack_374;
          auVar257._0_4_ = fVar201 * (float)local_390._0_4_;
          auVar257._4_4_ = fVar216 * (float)local_390._4_4_;
          auVar257._8_4_ = fVar217 * fStack_388;
          auVar257._12_4_ = fVar218 * fStack_384;
          auVar213._0_4_ = fVar201 * (float)local_3a0._0_4_;
          auVar213._4_4_ = fVar216 * (float)local_3a0._4_4_;
          auVar213._8_4_ = fVar217 * fStack_398;
          auVar213._12_4_ = fVar218 * fStack_394;
          auVar68 = vfmadd231ps_fma(auVar231,auVar54,local_330);
          auVar71 = vfmadd231ps_fma(auVar242,auVar54,local_340);
          auVar72 = vfmadd231ps_fma(auVar257,auVar54,local_350);
          auVar54 = vfmadd231ps_fma(auVar213,auVar54,local_360);
          auVar68 = vsubps_avx(auVar71,auVar68);
          auVar71 = vsubps_avx(auVar72,auVar71);
          auVar72 = vsubps_avx(auVar54,auVar72);
          auVar258._0_4_ = local_120 * auVar71._0_4_;
          auVar258._4_4_ = local_120 * auVar71._4_4_;
          auVar258._8_4_ = local_120 * auVar71._8_4_;
          auVar258._12_4_ = local_120 * auVar71._12_4_;
          auVar199._4_4_ = auVar199._0_4_;
          auVar199._8_4_ = auVar199._0_4_;
          auVar199._12_4_ = auVar199._0_4_;
          auVar68 = vfmadd231ps_fma(auVar258,auVar199,auVar68);
          auVar214._0_4_ = local_120 * auVar72._0_4_;
          auVar214._4_4_ = local_120 * auVar72._4_4_;
          auVar214._8_4_ = local_120 * auVar72._8_4_;
          auVar214._12_4_ = local_120 * auVar72._12_4_;
          auVar71 = vfmadd231ps_fma(auVar214,auVar199,auVar71);
          auVar215._0_4_ = local_120 * auVar71._0_4_;
          auVar215._4_4_ = local_120 * auVar71._4_4_;
          auVar215._8_4_ = local_120 * auVar71._8_4_;
          auVar215._12_4_ = local_120 * auVar71._12_4_;
          auVar68 = vfmadd231ps_fma(auVar215,auVar199,auVar68);
          auVar23._8_4_ = 0x40400000;
          auVar23._0_8_ = 0x4040000040400000;
          auVar23._12_4_ = 0x40400000;
          auVar90._0_16_ = vmulps_avx512vl(auVar68,auVar23);
          pGVar8 = (context->scene->geometries).items[uVar45].ptr;
          if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
          auVar189._0_4_ = fVar246 * (float)local_3e0._0_4_;
          auVar189._4_4_ = fVar246 * (float)local_3e0._4_4_;
          auVar189._8_4_ = fVar246 * fStack_3d8;
          auVar189._12_4_ = fVar246 * fStack_3d4;
          auVar167._4_4_ = fVar243;
          auVar167._0_4_ = fVar243;
          auVar167._8_4_ = fVar243;
          auVar167._12_4_ = fVar243;
          auVar68 = vfmadd132ps_fma(auVar167,auVar189,local_3d0);
          auVar150._4_4_ = fVar234;
          auVar150._0_4_ = fVar234;
          auVar150._8_4_ = fVar234;
          auVar150._12_4_ = fVar234;
          auVar68 = vfmadd132ps_fma(auVar150,auVar68,local_3c0);
          auVar143._4_4_ = fVar248;
          auVar143._0_4_ = fVar248;
          auVar143._8_4_ = fVar248;
          auVar143._12_4_ = fVar248;
          auVar72 = vfmadd132ps_fma(auVar143,auVar68,local_3b0);
          auVar68 = vshufps_avx(auVar72,auVar72,0xc9);
          auVar71 = vshufps_avx(auVar90._0_16_,auVar90._0_16_,0xc9);
          auVar144._0_4_ = auVar72._0_4_ * auVar71._0_4_;
          auVar144._4_4_ = auVar72._4_4_ * auVar71._4_4_;
          auVar144._8_4_ = auVar72._8_4_ * auVar71._8_4_;
          auVar144._12_4_ = auVar72._12_4_ * auVar71._12_4_;
          auVar68 = vfmsub231ps_fma(auVar144,auVar90._0_16_,auVar68);
          local_140 = auVar68._0_4_;
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            *(float *)(ray + k * 4 + 0x100) = fVar245;
            uVar119 = vextractps_avx(auVar68,1);
            *(undefined4 *)(ray + k * 4 + 0x180) = uVar119;
            uVar119 = vextractps_avx(auVar68,2);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar119;
            *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
            *(float *)(ray + k * 4 + 0x1e0) = local_120;
            *(float *)(ray + k * 4 + 0x200) = fVar244;
            *(uint *)(ray + k * 4 + 0x220) = uVar7;
            *(uint *)(ray + k * 4 + 0x240) = uVar45;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
            break;
          }
          auVar153._8_4_ = 1;
          auVar153._0_8_ = 0x100000001;
          auVar153._12_4_ = 1;
          auVar153._16_4_ = 1;
          auVar153._20_4_ = 1;
          auVar153._24_4_ = 1;
          auVar153._28_4_ = 1;
          local_100 = vpermps_avx2(auVar153,ZEXT1632(auVar51));
          auVar97 = vpermps_avx2(auVar153,ZEXT1632(auVar68));
          auVar171._8_4_ = 2;
          auVar171._0_8_ = 0x200000002;
          auVar171._12_4_ = 2;
          auVar171._16_4_ = 2;
          auVar171._20_4_ = 2;
          auVar171._24_4_ = 2;
          auVar171._28_4_ = 2;
          local_160 = vpermps_avx2(auVar171,ZEXT1632(auVar68));
          local_180[0] = (RTCHitN)auVar97[0];
          local_180[1] = (RTCHitN)auVar97[1];
          local_180[2] = (RTCHitN)auVar97[2];
          local_180[3] = (RTCHitN)auVar97[3];
          local_180[4] = (RTCHitN)auVar97[4];
          local_180[5] = (RTCHitN)auVar97[5];
          local_180[6] = (RTCHitN)auVar97[6];
          local_180[7] = (RTCHitN)auVar97[7];
          local_180[8] = (RTCHitN)auVar97[8];
          local_180[9] = (RTCHitN)auVar97[9];
          local_180[10] = (RTCHitN)auVar97[10];
          local_180[0xb] = (RTCHitN)auVar97[0xb];
          local_180[0xc] = (RTCHitN)auVar97[0xc];
          local_180[0xd] = (RTCHitN)auVar97[0xd];
          local_180[0xe] = (RTCHitN)auVar97[0xe];
          local_180[0xf] = (RTCHitN)auVar97[0xf];
          local_180[0x10] = (RTCHitN)auVar97[0x10];
          local_180[0x11] = (RTCHitN)auVar97[0x11];
          local_180[0x12] = (RTCHitN)auVar97[0x12];
          local_180[0x13] = (RTCHitN)auVar97[0x13];
          local_180[0x14] = (RTCHitN)auVar97[0x14];
          local_180[0x15] = (RTCHitN)auVar97[0x15];
          local_180[0x16] = (RTCHitN)auVar97[0x16];
          local_180[0x17] = (RTCHitN)auVar97[0x17];
          local_180[0x18] = (RTCHitN)auVar97[0x18];
          local_180[0x19] = (RTCHitN)auVar97[0x19];
          local_180[0x1a] = (RTCHitN)auVar97[0x1a];
          local_180[0x1b] = (RTCHitN)auVar97[0x1b];
          local_180[0x1c] = (RTCHitN)auVar97[0x1c];
          local_180[0x1d] = (RTCHitN)auVar97[0x1d];
          local_180[0x1e] = (RTCHitN)auVar97[0x1e];
          local_180[0x1f] = (RTCHitN)auVar97[0x1f];
          uStack_13c = local_140;
          uStack_138 = local_140;
          uStack_134 = local_140;
          uStack_130 = local_140;
          uStack_12c = local_140;
          uStack_128 = local_140;
          uStack_124 = local_140;
          fStack_11c = local_120;
          fStack_118 = local_120;
          fStack_114 = local_120;
          fStack_110 = local_120;
          fStack_10c = local_120;
          fStack_108 = local_120;
          fStack_104 = local_120;
          local_e0 = local_200._0_8_;
          uStack_d8 = local_200._8_8_;
          uStack_d0 = local_200._16_8_;
          uStack_c8 = local_200._24_8_;
          local_c0 = local_1e0;
          vpcmpeqd_avx2(local_1e0,local_1e0);
          uStack_9c = context->user->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = context->user->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          *(float *)(ray + k * 4 + 0x100) = fVar245;
          local_420 = local_220;
          local_470.valid = (int *)local_420;
          local_470.geometryUserPtr = pGVar8->userPtr;
          local_470.context = context->user;
          local_470.hit = local_180;
          local_470.N = 8;
          local_470.ray = (RTCRayN *)ray;
          if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar8->intersectionFilterN)(&local_470);
            auVar282 = ZEXT3264(_DAT_01feed20);
            in_ZMM22 = ZEXT464(0x3a83126f);
            auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
            auVar281 = ZEXT1664(auVar51);
            auVar97 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
            auVar280 = ZEXT3264(auVar97);
            auVar285 = ZEXT464(0x3f800000);
            auVar90._16_16_ = auVar97._16_16_;
            auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
            auVar286 = ZEXT1664(auVar51);
            auVar51 = vxorps_avx512vl(auVar66,auVar66);
            auVar279 = ZEXT1664(auVar51);
            auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar284 = ZEXT1664(auVar51);
            auVar90._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar283 = ZEXT1664(auVar90._0_16_);
          }
          auVar51 = auVar279._0_16_;
          if (local_420 != (undefined1  [32])0x0) {
            p_Var13 = context->args->filter;
            if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var13)(&local_470);
              auVar282 = ZEXT3264(_DAT_01feed20);
              in_ZMM22 = ZEXT464(0x3a83126f);
              auVar66 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
              auVar281 = ZEXT1664(auVar66);
              auVar97 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
              auVar280 = ZEXT3264(auVar97);
              auVar285 = ZEXT464(0x3f800000);
              auVar90._16_16_ = auVar97._16_16_;
              auVar66 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
              auVar286 = ZEXT1664(auVar66);
              auVar51 = vxorps_avx512vl(auVar51,auVar51);
              auVar279 = ZEXT1664(auVar51);
              auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar284 = ZEXT1664(auVar51);
              auVar90._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar283 = ZEXT1664(auVar90._0_16_);
            }
            if (local_420 != (undefined1  [32])0x0) {
              uVar3 = vptestmd_avx512vl(local_420,local_420);
              iVar117 = *(int *)(local_470.hit + 4);
              iVar31 = *(int *)(local_470.hit + 8);
              iVar32 = *(int *)(local_470.hit + 0xc);
              iVar33 = *(int *)(local_470.hit + 0x10);
              iVar34 = *(int *)(local_470.hit + 0x14);
              iVar35 = *(int *)(local_470.hit + 0x18);
              iVar36 = *(int *)(local_470.hit + 0x1c);
              bVar37 = (byte)uVar3;
              bVar48 = (bool)((byte)(uVar3 >> 1) & 1);
              bVar49 = (bool)((byte)(uVar3 >> 2) & 1);
              bVar46 = (bool)((byte)(uVar3 >> 3) & 1);
              bVar47 = (bool)((byte)(uVar3 >> 4) & 1);
              bVar14 = (bool)((byte)(uVar3 >> 5) & 1);
              bVar15 = (bool)((byte)(uVar3 >> 6) & 1);
              bVar16 = SUB81(uVar3 >> 7,0);
              *(uint *)(local_470.ray + 0x180) =
                   (uint)(bVar37 & 1) * *(int *)local_470.hit |
                   (uint)!(bool)(bVar37 & 1) * *(int *)(local_470.ray + 0x180);
              *(uint *)(local_470.ray + 0x184) =
                   (uint)bVar48 * iVar117 | (uint)!bVar48 * *(int *)(local_470.ray + 0x184);
              *(uint *)(local_470.ray + 0x188) =
                   (uint)bVar49 * iVar31 | (uint)!bVar49 * *(int *)(local_470.ray + 0x188);
              *(uint *)(local_470.ray + 0x18c) =
                   (uint)bVar46 * iVar32 | (uint)!bVar46 * *(int *)(local_470.ray + 0x18c);
              *(uint *)(local_470.ray + 400) =
                   (uint)bVar47 * iVar33 | (uint)!bVar47 * *(int *)(local_470.ray + 400);
              *(uint *)(local_470.ray + 0x194) =
                   (uint)bVar14 * iVar34 | (uint)!bVar14 * *(int *)(local_470.ray + 0x194);
              *(uint *)(local_470.ray + 0x198) =
                   (uint)bVar15 * iVar35 | (uint)!bVar15 * *(int *)(local_470.ray + 0x198);
              *(uint *)(local_470.ray + 0x19c) =
                   (uint)bVar16 * iVar36 | (uint)!bVar16 * *(int *)(local_470.ray + 0x19c);
              iVar117 = *(int *)(local_470.hit + 0x24);
              iVar31 = *(int *)(local_470.hit + 0x28);
              iVar32 = *(int *)(local_470.hit + 0x2c);
              iVar33 = *(int *)(local_470.hit + 0x30);
              iVar34 = *(int *)(local_470.hit + 0x34);
              iVar35 = *(int *)(local_470.hit + 0x38);
              iVar36 = *(int *)(local_470.hit + 0x3c);
              bVar48 = (bool)((byte)(uVar3 >> 1) & 1);
              bVar49 = (bool)((byte)(uVar3 >> 2) & 1);
              bVar46 = (bool)((byte)(uVar3 >> 3) & 1);
              bVar47 = (bool)((byte)(uVar3 >> 4) & 1);
              bVar14 = (bool)((byte)(uVar3 >> 5) & 1);
              bVar15 = (bool)((byte)(uVar3 >> 6) & 1);
              bVar16 = SUB81(uVar3 >> 7,0);
              *(uint *)(local_470.ray + 0x1a0) =
                   (uint)(bVar37 & 1) * *(int *)(local_470.hit + 0x20) |
                   (uint)!(bool)(bVar37 & 1) * *(int *)(local_470.ray + 0x1a0);
              *(uint *)(local_470.ray + 0x1a4) =
                   (uint)bVar48 * iVar117 | (uint)!bVar48 * *(int *)(local_470.ray + 0x1a4);
              *(uint *)(local_470.ray + 0x1a8) =
                   (uint)bVar49 * iVar31 | (uint)!bVar49 * *(int *)(local_470.ray + 0x1a8);
              *(uint *)(local_470.ray + 0x1ac) =
                   (uint)bVar46 * iVar32 | (uint)!bVar46 * *(int *)(local_470.ray + 0x1ac);
              *(uint *)(local_470.ray + 0x1b0) =
                   (uint)bVar47 * iVar33 | (uint)!bVar47 * *(int *)(local_470.ray + 0x1b0);
              *(uint *)(local_470.ray + 0x1b4) =
                   (uint)bVar14 * iVar34 | (uint)!bVar14 * *(int *)(local_470.ray + 0x1b4);
              *(uint *)(local_470.ray + 0x1b8) =
                   (uint)bVar15 * iVar35 | (uint)!bVar15 * *(int *)(local_470.ray + 0x1b8);
              *(uint *)(local_470.ray + 0x1bc) =
                   (uint)bVar16 * iVar36 | (uint)!bVar16 * *(int *)(local_470.ray + 0x1bc);
              iVar117 = *(int *)(local_470.hit + 0x44);
              iVar31 = *(int *)(local_470.hit + 0x48);
              iVar32 = *(int *)(local_470.hit + 0x4c);
              iVar33 = *(int *)(local_470.hit + 0x50);
              iVar34 = *(int *)(local_470.hit + 0x54);
              iVar35 = *(int *)(local_470.hit + 0x58);
              iVar36 = *(int *)(local_470.hit + 0x5c);
              bVar48 = (bool)((byte)(uVar3 >> 1) & 1);
              bVar49 = (bool)((byte)(uVar3 >> 2) & 1);
              bVar46 = (bool)((byte)(uVar3 >> 3) & 1);
              bVar47 = (bool)((byte)(uVar3 >> 4) & 1);
              bVar14 = (bool)((byte)(uVar3 >> 5) & 1);
              bVar15 = (bool)((byte)(uVar3 >> 6) & 1);
              bVar16 = SUB81(uVar3 >> 7,0);
              *(uint *)(local_470.ray + 0x1c0) =
                   (uint)(bVar37 & 1) * *(int *)(local_470.hit + 0x40) |
                   (uint)!(bool)(bVar37 & 1) * *(int *)(local_470.ray + 0x1c0);
              *(uint *)(local_470.ray + 0x1c4) =
                   (uint)bVar48 * iVar117 | (uint)!bVar48 * *(int *)(local_470.ray + 0x1c4);
              *(uint *)(local_470.ray + 0x1c8) =
                   (uint)bVar49 * iVar31 | (uint)!bVar49 * *(int *)(local_470.ray + 0x1c8);
              *(uint *)(local_470.ray + 0x1cc) =
                   (uint)bVar46 * iVar32 | (uint)!bVar46 * *(int *)(local_470.ray + 0x1cc);
              *(uint *)(local_470.ray + 0x1d0) =
                   (uint)bVar47 * iVar33 | (uint)!bVar47 * *(int *)(local_470.ray + 0x1d0);
              *(uint *)(local_470.ray + 0x1d4) =
                   (uint)bVar14 * iVar34 | (uint)!bVar14 * *(int *)(local_470.ray + 0x1d4);
              *(uint *)(local_470.ray + 0x1d8) =
                   (uint)bVar15 * iVar35 | (uint)!bVar15 * *(int *)(local_470.ray + 0x1d8);
              *(uint *)(local_470.ray + 0x1dc) =
                   (uint)bVar16 * iVar36 | (uint)!bVar16 * *(int *)(local_470.ray + 0x1dc);
              iVar117 = *(int *)(local_470.hit + 100);
              iVar31 = *(int *)(local_470.hit + 0x68);
              iVar32 = *(int *)(local_470.hit + 0x6c);
              iVar33 = *(int *)(local_470.hit + 0x70);
              iVar34 = *(int *)(local_470.hit + 0x74);
              iVar35 = *(int *)(local_470.hit + 0x78);
              iVar36 = *(int *)(local_470.hit + 0x7c);
              bVar48 = (bool)((byte)(uVar3 >> 1) & 1);
              bVar49 = (bool)((byte)(uVar3 >> 2) & 1);
              bVar46 = (bool)((byte)(uVar3 >> 3) & 1);
              bVar47 = (bool)((byte)(uVar3 >> 4) & 1);
              bVar14 = (bool)((byte)(uVar3 >> 5) & 1);
              bVar15 = (bool)((byte)(uVar3 >> 6) & 1);
              bVar16 = SUB81(uVar3 >> 7,0);
              *(uint *)(local_470.ray + 0x1e0) =
                   (uint)(bVar37 & 1) * *(int *)(local_470.hit + 0x60) |
                   (uint)!(bool)(bVar37 & 1) * *(int *)(local_470.ray + 0x1e0);
              *(uint *)(local_470.ray + 0x1e4) =
                   (uint)bVar48 * iVar117 | (uint)!bVar48 * *(int *)(local_470.ray + 0x1e4);
              *(uint *)(local_470.ray + 0x1e8) =
                   (uint)bVar49 * iVar31 | (uint)!bVar49 * *(int *)(local_470.ray + 0x1e8);
              *(uint *)(local_470.ray + 0x1ec) =
                   (uint)bVar46 * iVar32 | (uint)!bVar46 * *(int *)(local_470.ray + 0x1ec);
              *(uint *)(local_470.ray + 0x1f0) =
                   (uint)bVar47 * iVar33 | (uint)!bVar47 * *(int *)(local_470.ray + 0x1f0);
              *(uint *)(local_470.ray + 500) =
                   (uint)bVar14 * iVar34 | (uint)!bVar14 * *(int *)(local_470.ray + 500);
              *(uint *)(local_470.ray + 0x1f8) =
                   (uint)bVar15 * iVar35 | (uint)!bVar15 * *(int *)(local_470.ray + 0x1f8);
              *(uint *)(local_470.ray + 0x1fc) =
                   (uint)bVar16 * iVar36 | (uint)!bVar16 * *(int *)(local_470.ray + 0x1fc);
              iVar117 = *(int *)(local_470.ray + 0x204);
              iVar31 = *(int *)(local_470.ray + 0x208);
              iVar32 = *(int *)(local_470.ray + 0x20c);
              iVar33 = *(int *)(local_470.ray + 0x210);
              iVar34 = *(int *)(local_470.ray + 0x214);
              iVar35 = *(int *)(local_470.ray + 0x218);
              iVar36 = *(int *)(local_470.ray + 0x21c);
              auVar112._0_4_ =
                   (uint)(bVar37 & 1) * *(int *)(local_470.hit + 0x80) |
                   (uint)!(bool)(bVar37 & 1) * *(int *)(local_470.ray + 0x200);
              bVar48 = (bool)((byte)(uVar3 >> 1) & 1);
              auVar112._4_4_ =
                   (uint)bVar48 * *(int *)(local_470.hit + 0x84) | (uint)!bVar48 * iVar117;
              bVar48 = (bool)((byte)(uVar3 >> 2) & 1);
              auVar112._8_4_ =
                   (uint)bVar48 * *(int *)(local_470.hit + 0x88) | (uint)!bVar48 * iVar31;
              bVar48 = (bool)((byte)(uVar3 >> 3) & 1);
              auVar112._12_4_ =
                   (uint)bVar48 * *(int *)(local_470.hit + 0x8c) | (uint)!bVar48 * iVar32;
              bVar48 = (bool)((byte)(uVar3 >> 4) & 1);
              auVar112._16_4_ =
                   (uint)bVar48 * *(int *)(local_470.hit + 0x90) | (uint)!bVar48 * iVar33;
              bVar48 = (bool)((byte)(uVar3 >> 5) & 1);
              auVar112._20_4_ =
                   (uint)bVar48 * *(int *)(local_470.hit + 0x94) | (uint)!bVar48 * iVar34;
              bVar48 = (bool)((byte)(uVar3 >> 6) & 1);
              auVar112._24_4_ =
                   (uint)bVar48 * *(int *)(local_470.hit + 0x98) | (uint)!bVar48 * iVar35;
              bVar48 = SUB81(uVar3 >> 7,0);
              auVar112._28_4_ =
                   (uint)bVar48 * *(int *)(local_470.hit + 0x9c) | (uint)!bVar48 * iVar36;
              *(undefined1 (*) [32])(local_470.ray + 0x200) = auVar112;
              bVar48 = (bool)((byte)(uVar3 >> 1) & 1);
              uVar116 = bVar48 * auVar112._4_4_ | (uint)!bVar48 * iVar117;
              auVar27._4_24_ = auVar112._8_24_;
              auVar27._0_4_ = uVar116;
              auVar113._0_8_ = auVar27._0_8_ << 0x20;
              bVar48 = (bool)((byte)(uVar3 >> 2) & 1);
              auVar113._8_4_ = bVar48 * auVar112._8_4_ | (uint)!bVar48 * iVar31;
              bVar48 = (bool)((byte)(uVar3 >> 3) & 1);
              auVar113._12_4_ = bVar48 * auVar112._12_4_ | (uint)!bVar48 * iVar32;
              bVar48 = (bool)((byte)(uVar3 >> 4) & 1);
              auVar113._16_4_ = bVar48 * auVar112._16_4_ | (uint)!bVar48 * iVar33;
              bVar48 = (bool)((byte)(uVar3 >> 5) & 1);
              auVar113._20_4_ = bVar48 * auVar112._20_4_ | (uint)!bVar48 * iVar34;
              bVar48 = (bool)((byte)(uVar3 >> 6) & 1);
              auVar113._24_4_ = bVar48 * auVar112._24_4_ | (uint)!bVar48 * iVar35;
              bVar48 = SUB81(uVar3 >> 7,0);
              auVar113._28_4_ = bVar48 * auVar112._28_4_ | (uint)!bVar48 * iVar36;
              auVar97 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_470.hit + 0xa0));
              *(undefined1 (*) [32])(local_470.ray + 0x220) = auVar97;
              bVar48 = (bool)((byte)(uVar3 >> 1) & 1);
              uVar116 = bVar48 * uVar116 | (uint)!bVar48 * iVar117;
              auVar28._4_24_ = auVar113._8_24_;
              auVar28._0_4_ = uVar116;
              auVar114._0_8_ = auVar28._0_8_ << 0x20;
              bVar48 = (bool)((byte)(uVar3 >> 2) & 1);
              auVar114._8_4_ = bVar48 * auVar113._8_4_ | (uint)!bVar48 * iVar31;
              bVar48 = (bool)((byte)(uVar3 >> 3) & 1);
              auVar114._12_4_ = bVar48 * auVar113._12_4_ | (uint)!bVar48 * iVar32;
              bVar48 = (bool)((byte)(uVar3 >> 4) & 1);
              auVar114._16_4_ = bVar48 * auVar113._16_4_ | (uint)!bVar48 * iVar33;
              bVar48 = (bool)((byte)(uVar3 >> 5) & 1);
              auVar114._20_4_ = bVar48 * auVar113._20_4_ | (uint)!bVar48 * iVar34;
              bVar48 = (bool)((byte)(uVar3 >> 6) & 1);
              auVar114._24_4_ = bVar48 * auVar113._24_4_ | (uint)!bVar48 * iVar35;
              bVar48 = SUB81(uVar3 >> 7,0);
              auVar114._28_4_ = bVar48 * auVar113._28_4_ | (uint)!bVar48 * iVar36;
              auVar97 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_470.hit + 0xc0));
              *(undefined1 (*) [32])(local_470.ray + 0x240) = auVar97;
              bVar48 = (bool)((byte)(uVar3 >> 1) & 1);
              uVar116 = bVar48 * uVar116 | (uint)!bVar48 * iVar117;
              auVar29._4_24_ = auVar114._8_24_;
              auVar29._0_4_ = uVar116;
              auVar115._0_8_ = auVar29._0_8_ << 0x20;
              bVar48 = (bool)((byte)(uVar3 >> 2) & 1);
              auVar115._8_4_ = bVar48 * auVar114._8_4_ | (uint)!bVar48 * iVar31;
              bVar48 = (bool)((byte)(uVar3 >> 3) & 1);
              auVar115._12_4_ = bVar48 * auVar114._12_4_ | (uint)!bVar48 * iVar32;
              bVar48 = (bool)((byte)(uVar3 >> 4) & 1);
              auVar115._16_4_ = bVar48 * auVar114._16_4_ | (uint)!bVar48 * iVar33;
              bVar48 = (bool)((byte)(uVar3 >> 5) & 1);
              auVar115._20_4_ = bVar48 * auVar114._20_4_ | (uint)!bVar48 * iVar34;
              bVar48 = (bool)((byte)(uVar3 >> 6) & 1);
              auVar115._24_4_ = bVar48 * auVar114._24_4_ | (uint)!bVar48 * iVar35;
              bVar48 = SUB81(uVar3 >> 7,0);
              auVar115._28_4_ = bVar48 * auVar114._28_4_ | (uint)!bVar48 * iVar36;
              auVar97 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_470.hit + 0xe0));
              *(undefined1 (*) [32])(local_470.ray + 0x260) = auVar97;
              bVar48 = (bool)((byte)(uVar3 >> 1) & 1);
              auVar30._4_24_ = auVar115._8_24_;
              auVar30._0_4_ = bVar48 * uVar116 | (uint)!bVar48 * iVar117;
              auVar90._0_8_ = auVar30._0_8_ << 0x20;
              bVar48 = (bool)((byte)(uVar3 >> 2) & 1);
              auVar90._8_4_ = bVar48 * auVar115._8_4_ | (uint)!bVar48 * iVar31;
              bVar48 = (bool)((byte)(uVar3 >> 3) & 1);
              auVar90._12_4_ = bVar48 * auVar115._12_4_ | (uint)!bVar48 * iVar32;
              bVar48 = (bool)((byte)(uVar3 >> 4) & 1);
              auVar90._16_4_ = bVar48 * auVar115._16_4_ | (uint)!bVar48 * iVar33;
              bVar48 = (bool)((byte)(uVar3 >> 5) & 1);
              auVar90._20_4_ = bVar48 * auVar115._20_4_ | (uint)!bVar48 * iVar34;
              bVar48 = (bool)((byte)(uVar3 >> 6) & 1);
              auVar90._24_4_ = bVar48 * auVar115._24_4_ | (uint)!bVar48 * iVar35;
              bVar48 = SUB81(uVar3 >> 7,0);
              auVar90._28_4_ = bVar48 * auVar115._28_4_ | (uint)!bVar48 * iVar36;
              auVar97 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_470.hit + 0x100));
              *(undefined1 (*) [32])(local_470.ray + 0x280) = auVar97;
              break;
            }
          }
          *(float *)(ray + k * 4 + 0x100) = fVar247;
          break;
        }
        lVar41 = lVar41 + -1;
      } while (lVar41 != 0);
      goto LAB_01bc9983;
    }
    auVar132 = vinsertps_avx(auVar73,auVar74,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }